

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTest.cxx
# Opt level: O0

bool __thiscall
cmCTest::HandleCommandLineArguments
          (cmCTest *this,size_t *i,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,string *errormsg)

{
  ulong uVar1;
  string_view view;
  basic_string_view<char,_std::char_traits<char>_> __x;
  string_view prefix;
  string_view sVar2;
  string_view sVar3;
  string_view sVar4;
  string_view sVar5;
  string_view sVar6;
  string_view sVar7;
  string_view sVar8;
  string_view sVar9;
  string_view sVar10;
  string_view sVar11;
  string_view sVar12;
  basic_string_view<char,_std::char_traits<char>_> bVar13;
  string_view sVar14;
  string_view sVar15;
  string_view sVar16;
  string_view sVar17;
  string_view sVar18;
  string_view sVar19;
  string_view sVar20;
  string_view sVar21;
  string_view sVar22;
  string_view sVar23;
  string_view sVar24;
  basic_string_view<char,_std::char_traits<char>_> bVar25;
  bool bVar26;
  bool bVar27;
  int iVar28;
  reference pvVar29;
  ostream *poVar30;
  pointer pPVar31;
  size_type sVar32;
  char *pcVar33;
  cmCTestTestHandler *pcVar34;
  cmCTestMemCheckHandler *pcVar35;
  char *in_R8;
  static_string_view sVar36;
  string_view sVar37;
  string_view varg1;
  string_view varg1_00;
  string_view varg1_01;
  string_view varg1_02;
  string_view varg1_03;
  string_view varg1_04;
  string_view varg1_05;
  string_view varg1_06;
  string_view varg1_07;
  string_view varg1_08;
  string_view varg1_09;
  string_view varg1_10;
  string_view varg1_11;
  string_view varg1_12;
  string_view varg1_13;
  string_view varg1_14;
  string_view varg1_15;
  string_view varg1_16;
  string_view varg1_17;
  string_view varg1_18;
  string_view varg1_19;
  string_view varg1_20;
  string_view varg1_21;
  string_view varg1_22;
  string_view varg1_23;
  string_view varg1_24;
  string_view varg1_25;
  string_view varg1_26;
  string_view varg1_27;
  string_view varg1_28;
  string_view varg1_29;
  string_view varg1_30;
  string_view varg1_31;
  string_view varg1_32;
  string_view varg1_33;
  string_view varg1_34;
  string_view varg1_35;
  string_view varg1_36;
  string_view varg1_37;
  string_view varg1_38;
  string_view varg1_39;
  string_view varg1_40;
  string_view varg1_41;
  string_view varg1_42;
  string_view varg1_43;
  string_view varg1_44;
  string_view varg1_45;
  allocator<char> local_13c1;
  string local_13c0;
  allocator<char> local_1399;
  string local_1398;
  string_view local_1378;
  string_view local_1368;
  allocator<char> local_1351;
  string local_1350;
  allocator<char> local_1329;
  string local_1328;
  string_view local_1308;
  string_view local_12f8;
  allocator<char> local_12e1;
  string local_12e0;
  allocator<char> local_12b9;
  string local_12b8;
  string_view local_1298;
  string_view local_1288;
  allocator<char> local_1271;
  string local_1270;
  allocator<char> local_1249;
  string local_1248;
  string_view local_1228;
  string_view local_1218;
  allocator<char> local_1201;
  string local_1200;
  allocator<char> local_11d9;
  string local_11d8;
  string_view local_11b8;
  string_view local_11a8;
  allocator<char> local_1191;
  string local_1190;
  allocator<char> local_1169;
  string local_1168;
  string_view local_1148;
  string_view local_1138;
  allocator<char> local_1121;
  string local_1120;
  allocator<char> local_10f9;
  string local_10f8;
  string_view local_10d8;
  string_view local_10c8;
  allocator<char> local_10b1;
  string local_10b0;
  allocator<char> local_1089;
  string local_1088;
  string_view local_1068;
  string_view local_1058;
  allocator<char> local_1041;
  string local_1040;
  allocator<char> local_1019;
  string local_1018;
  string_view local_ff8;
  string_view local_fe8;
  allocator<char> local_fd1;
  string local_fd0;
  allocator<char> local_fa9;
  string local_fa8;
  string_view local_f88;
  string_view local_f78;
  allocator<char> local_f61;
  string local_f60;
  allocator<char> local_f39;
  string local_f38;
  string_view local_f18;
  string_view local_f08;
  char local_ee9;
  size_t local_ee8;
  size_t sStack_ee0;
  cmAlphaNum local_ed8;
  cmAlphaNum local_ea8;
  string local_e78;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e58;
  size_t local_e48;
  char *local_e40;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> local_e38;
  basic_string_view<char,_std::char_traits<char>_> local_e28;
  basic_string_view<char,_std::char_traits<char>_> local_e18;
  size_t sStack_e08;
  string_view noTestsMode;
  undefined1 auStack_dd8 [8];
  string_view noTestsPrefix;
  string local_d88 [32];
  string_view local_d68;
  string_view local_d58;
  allocator<char> local_d39;
  string local_d38;
  string_view local_d18;
  string_view local_d08;
  string_view local_cf8;
  string_view local_ce8;
  string_view local_cd8;
  string_view local_cc8;
  string_view local_cb8;
  string_view local_ca8;
  string_view local_c98;
  string_view local_c88;
  string_view local_c78;
  string_view local_c68;
  string_view local_c58;
  string_view local_c48;
  string_view local_c38;
  string_view local_c28;
  string_view local_c18;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_c00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_be0;
  undefined1 local_bc0 [8];
  string format;
  string local_b98 [8];
  string argWithFormat;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b48;
  string_view local_b28;
  string_view local_b18;
  string local_b08 [32];
  undefined1 local_ae8 [8];
  ostringstream cmCTestLog_msg_2;
  int local_970 [2];
  long outputSize_1;
  char *pcStack_960;
  string *local_958;
  char *pcStack_950;
  string local_948 [32];
  undefined1 local_928 [8];
  ostringstream cmCTestLog_msg_1;
  int local_7b0 [2];
  long outputSize;
  char *pcStack_7a0;
  string *local_798;
  char *pcStack_790;
  string_view local_788;
  string_view local_778;
  string_view local_768;
  string_view local_758;
  string_view local_748;
  string_view local_738;
  string_view local_728;
  string_view local_718;
  string_view local_708;
  string_view local_6f8;
  string_view local_6e8;
  string_view local_6d8;
  string_view local_6c8;
  string_view local_6b8;
  string_view local_6a8;
  string_view local_698;
  string_view local_688;
  string_view local_678;
  string_view local_668;
  string_view local_658;
  string_view local_648;
  string_view local_638;
  string_view local_628;
  string_view local_618;
  string_view local_608;
  string_view local_5f8;
  string_view local_5e8;
  string_view local_5d8;
  double local_5c8;
  rep_conflict local_5c0;
  cmDuration timeout;
  string local_538 [32];
  undefined1 local_518 [8];
  ostringstream cmCTestLog_msg;
  unsigned_long local_3a0;
  unsigned_long load;
  char *pcStack_390;
  string *local_388;
  char *pcStack_380;
  cmAlphaNum local_370;
  cmAlphaNum local_340;
  string local_310;
  string local_2f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_2d0;
  string *mode;
  unsigned_long n;
  string *local_2a0;
  string *count;
  RegularExpression repeatRegex;
  cmAlphaNum local_1a8;
  cmAlphaNum local_178;
  string local_148;
  long local_128;
  long repeat;
  string_view local_118;
  string_view local_108;
  string local_f8 [36];
  int local_d4;
  undefined1 auStack_d0 [4];
  int plevel_1;
  string_view local_c0;
  int local_ac;
  undefined1 auStack_a8 [4];
  int plevel;
  char *pcStack_a0;
  string_view local_98;
  string_view local_78;
  string_view local_68;
  cmCTest local_50;
  string arg;
  string *errormsg_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *args_local;
  size_t *i_local;
  cmCTest *this_local;
  
  arg.field_2._8_8_ = errormsg;
  pvVar29 = std::
            vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::operator[](args,*i);
  std::__cxx11::string::string((string *)&local_50,(string *)pvVar29);
  local_78 = (string_view)::cm::operator____s("-F",2);
  sVar37._M_len = local_78._M_str;
  sVar37._M_str = (char *)0x0;
  local_68 = local_78;
  bVar26 = CheckArgument(&local_50,(string *)local_78._M_len,sVar37,in_R8);
  if (bVar26) {
    pPVar31 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::operator->
                        (&this->Impl);
    pPVar31->Failover = true;
  }
  else {
    _auStack_a8 = (string_view)::cm::operator____s("-j",2);
    varg1._M_len = auStack_a8._8_8_;
    varg1._M_str = "--parallel";
    local_98 = _auStack_a8;
    bVar27 = CheckArgument(&local_50,(string *)auStack_a8._0_8_,varg1,in_R8);
    bVar26 = false;
    if (bVar27) {
      uVar1 = *i;
      sVar32 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(args);
      bVar26 = uVar1 < sVar32 - 1;
    }
    if (bVar26) {
      *i = *i + 1;
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,*i);
      pcVar33 = (char *)std::__cxx11::string::c_str();
      local_ac = atoi(pcVar33);
      SetParallelLevel(this,local_ac);
      pPVar31 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                operator->(&this->Impl);
      pPVar31->ParallelLevelSetInCli = true;
    }
    else {
      local_c0 = (string_view)
                 std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
                ((basic_string_view<char,_std::char_traits<char>_> *)auStack_d0,"-j");
      bVar26 = cmHasPrefix(local_c0,_auStack_d0);
      if (bVar26) {
        std::__cxx11::string::substr((ulong)local_f8,(ulong)&local_50);
        pcVar33 = (char *)std::__cxx11::string::c_str();
        iVar28 = atoi(pcVar33);
        std::__cxx11::string::~string(local_f8);
        local_d4 = iVar28;
        SetParallelLevel(this,iVar28);
        pPVar31 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                  operator->(&this->Impl);
        pPVar31->ParallelLevelSetInCli = true;
      }
      else {
        local_118 = (string_view)::cm::operator____s("--repeat-until-fail",0x13);
        varg1_00._M_len = local_118._M_str;
        varg1_00._M_str = (char *)0x0;
        local_108 = local_118;
        bVar26 = CheckArgument(&local_50,(string *)local_118._M_len,varg1_00,in_R8);
        if (bVar26) {
          uVar1 = *i;
          sVar32 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(args);
          if (sVar32 - 1 <= uVar1) {
            std::__cxx11::string::operator=
                      ((string *)arg.field_2._8_8_,"\'--repeat-until-fail\' requires an argument");
            bVar25._M_str = local_e18._M_str;
            bVar25._M_len = local_e18._M_len;
            sVar24._M_str = local_f08._M_str;
            sVar24._M_len = local_f08._M_len;
            sVar23._M_str = local_f78._M_str;
            sVar23._M_len = local_f78._M_len;
            sVar22._M_str = local_fe8._M_str;
            sVar22._M_len = local_fe8._M_len;
            sVar21._M_str = local_1058._M_str;
            sVar21._M_len = local_1058._M_len;
            sVar20._M_str = local_10c8._M_str;
            sVar20._M_len = local_10c8._M_len;
            sVar19._M_str = local_1138._M_str;
            sVar19._M_len = local_1138._M_len;
            sVar18._M_str = local_11a8._M_str;
            sVar18._M_len = local_11a8._M_len;
            sVar17._M_str = local_1218._M_str;
            sVar17._M_len = local_1218._M_len;
            sVar16._M_str = local_1288._M_str;
            sVar16._M_len = local_1288._M_len;
            sVar15._M_str = local_12f8._M_str;
            sVar15._M_len = local_12f8._M_len;
            sVar14._M_str = local_1368._M_str;
            sVar14._M_len = local_1368._M_len;
            bVar13._M_str = local_e28._M_str;
            bVar13._M_len = local_e28._M_len;
            sVar12._M_str = local_f18._M_str;
            sVar12._M_len = local_f18._M_len;
            sVar11._M_str = local_f88._M_str;
            sVar11._M_len = local_f88._M_len;
            sVar10._M_str = local_ff8._M_str;
            sVar10._M_len = local_ff8._M_len;
            sVar9._M_str = local_1068._M_str;
            sVar9._M_len = local_1068._M_len;
            sVar8._M_str = local_10d8._M_str;
            sVar8._M_len = local_10d8._M_len;
            sVar7._M_str = local_1148._M_str;
            sVar7._M_len = local_1148._M_len;
            sVar6._M_str = local_11b8._M_str;
            sVar6._M_len = local_11b8._M_len;
            sVar5._M_str = local_1228._M_str;
            sVar5._M_len = local_1228._M_len;
            sVar4._M_str = local_1298._M_str;
            sVar4._M_len = local_1298._M_len;
            sVar3._M_str = local_1308._M_str;
            sVar3._M_len = local_1308._M_len;
            sVar2._M_str = local_1378._M_str;
            sVar2._M_len = local_1378._M_len;
            this_local._7_1_ = 0;
            repeat._4_4_ = 1;
            goto LAB_00179228;
          }
          pPVar31 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                    operator->(&this->Impl);
          if (pPVar31->RepeatMode != Never) {
            std::__cxx11::string::operator=
                      ((string *)arg.field_2._8_8_,"At most one \'--repeat\' option may be used.");
            bVar25._M_str = local_e18._M_str;
            bVar25._M_len = local_e18._M_len;
            sVar24._M_str = local_f08._M_str;
            sVar24._M_len = local_f08._M_len;
            sVar23._M_str = local_f78._M_str;
            sVar23._M_len = local_f78._M_len;
            sVar22._M_str = local_fe8._M_str;
            sVar22._M_len = local_fe8._M_len;
            sVar21._M_str = local_1058._M_str;
            sVar21._M_len = local_1058._M_len;
            sVar20._M_str = local_10c8._M_str;
            sVar20._M_len = local_10c8._M_len;
            sVar19._M_str = local_1138._M_str;
            sVar19._M_len = local_1138._M_len;
            sVar18._M_str = local_11a8._M_str;
            sVar18._M_len = local_11a8._M_len;
            sVar17._M_str = local_1218._M_str;
            sVar17._M_len = local_1218._M_len;
            sVar16._M_str = local_1288._M_str;
            sVar16._M_len = local_1288._M_len;
            sVar15._M_str = local_12f8._M_str;
            sVar15._M_len = local_12f8._M_len;
            sVar14._M_str = local_1368._M_str;
            sVar14._M_len = local_1368._M_len;
            bVar13._M_str = local_e28._M_str;
            bVar13._M_len = local_e28._M_len;
            sVar12._M_str = local_f18._M_str;
            sVar12._M_len = local_f18._M_len;
            sVar11._M_str = local_f88._M_str;
            sVar11._M_len = local_f88._M_len;
            sVar10._M_str = local_ff8._M_str;
            sVar10._M_len = local_ff8._M_len;
            sVar9._M_str = local_1068._M_str;
            sVar9._M_len = local_1068._M_len;
            sVar8._M_str = local_10d8._M_str;
            sVar8._M_len = local_10d8._M_len;
            sVar7._M_str = local_1148._M_str;
            sVar7._M_len = local_1148._M_len;
            sVar6._M_str = local_11b8._M_str;
            sVar6._M_len = local_11b8._M_len;
            sVar5._M_str = local_1228._M_str;
            sVar5._M_len = local_1228._M_len;
            sVar4._M_str = local_1298._M_str;
            sVar4._M_len = local_1298._M_len;
            sVar3._M_str = local_1308._M_str;
            sVar3._M_len = local_1308._M_len;
            sVar2._M_str = local_1378._M_str;
            sVar2._M_len = local_1378._M_len;
            this_local._7_1_ = 0;
            repeat._4_4_ = 1;
            goto LAB_00179228;
          }
          *i = *i + 1;
          local_128 = 1;
          pvVar29 = std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](args,*i);
          bVar26 = cmStrToLong(pvVar29,&local_128);
          if (!bVar26) {
            cmAlphaNum::cmAlphaNum(&local_178,"\'--repeat-until-fail\' given non-integer value \'");
            pvVar29 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](args,*i);
            cmAlphaNum::cmAlphaNum(&local_1a8,pvVar29);
            cmStrCat<char[2]>(&local_148,&local_178,&local_1a8,(char (*) [2])0xd6b6e4);
            std::__cxx11::string::operator=((string *)arg.field_2._8_8_,(string *)&local_148);
            std::__cxx11::string::~string((string *)&local_148);
            bVar25._M_str = local_e18._M_str;
            bVar25._M_len = local_e18._M_len;
            sVar24._M_str = local_f08._M_str;
            sVar24._M_len = local_f08._M_len;
            sVar23._M_str = local_f78._M_str;
            sVar23._M_len = local_f78._M_len;
            sVar22._M_str = local_fe8._M_str;
            sVar22._M_len = local_fe8._M_len;
            sVar21._M_str = local_1058._M_str;
            sVar21._M_len = local_1058._M_len;
            sVar20._M_str = local_10c8._M_str;
            sVar20._M_len = local_10c8._M_len;
            sVar19._M_str = local_1138._M_str;
            sVar19._M_len = local_1138._M_len;
            sVar18._M_str = local_11a8._M_str;
            sVar18._M_len = local_11a8._M_len;
            sVar17._M_str = local_1218._M_str;
            sVar17._M_len = local_1218._M_len;
            sVar16._M_str = local_1288._M_str;
            sVar16._M_len = local_1288._M_len;
            sVar15._M_str = local_12f8._M_str;
            sVar15._M_len = local_12f8._M_len;
            sVar14._M_str = local_1368._M_str;
            sVar14._M_len = local_1368._M_len;
            bVar13._M_str = local_e28._M_str;
            bVar13._M_len = local_e28._M_len;
            sVar12._M_str = local_f18._M_str;
            sVar12._M_len = local_f18._M_len;
            sVar11._M_str = local_f88._M_str;
            sVar11._M_len = local_f88._M_len;
            sVar10._M_str = local_ff8._M_str;
            sVar10._M_len = local_ff8._M_len;
            sVar9._M_str = local_1068._M_str;
            sVar9._M_len = local_1068._M_len;
            sVar8._M_str = local_10d8._M_str;
            sVar8._M_len = local_10d8._M_len;
            sVar7._M_str = local_1148._M_str;
            sVar7._M_len = local_1148._M_len;
            sVar6._M_str = local_11b8._M_str;
            sVar6._M_len = local_11b8._M_len;
            sVar5._M_str = local_1228._M_str;
            sVar5._M_len = local_1228._M_len;
            sVar4._M_str = local_1298._M_str;
            sVar4._M_len = local_1298._M_len;
            sVar3._M_str = local_1308._M_str;
            sVar3._M_len = local_1308._M_len;
            sVar2._M_str = local_1378._M_str;
            sVar2._M_len = local_1378._M_len;
            this_local._7_1_ = 0;
            repeat._4_4_ = 1;
            goto LAB_00179228;
          }
          iVar28 = (int)local_128;
          pPVar31 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                    operator->(&this->Impl);
          pPVar31->RepeatCount = iVar28;
          if (1 < local_128) {
            pPVar31 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                      operator->(&this->Impl);
            pPVar31->RepeatMode = UntilFail;
          }
        }
        else {
          sVar36 = ::cm::operator____s("--repeat",8);
          varg1_01._M_len = sVar36.super_string_view._M_str;
          repeatRegex._200_8_ = sVar36.super_string_view._M_len;
          varg1_01._M_str = (char *)0x0;
          bVar26 = CheckArgument(&local_50,(string *)repeatRegex._200_8_,varg1_01,in_R8);
          if (bVar26) {
            uVar1 = *i;
            sVar32 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(args);
            if (sVar32 - 1 <= uVar1) {
              std::__cxx11::string::operator=
                        ((string *)arg.field_2._8_8_,"\'--repeat\' requires an argument");
              bVar25._M_str = local_e18._M_str;
              bVar25._M_len = local_e18._M_len;
              sVar24._M_str = local_f08._M_str;
              sVar24._M_len = local_f08._M_len;
              sVar23._M_str = local_f78._M_str;
              sVar23._M_len = local_f78._M_len;
              sVar22._M_str = local_fe8._M_str;
              sVar22._M_len = local_fe8._M_len;
              sVar21._M_str = local_1058._M_str;
              sVar21._M_len = local_1058._M_len;
              sVar20._M_str = local_10c8._M_str;
              sVar20._M_len = local_10c8._M_len;
              sVar19._M_str = local_1138._M_str;
              sVar19._M_len = local_1138._M_len;
              sVar18._M_str = local_11a8._M_str;
              sVar18._M_len = local_11a8._M_len;
              sVar17._M_str = local_1218._M_str;
              sVar17._M_len = local_1218._M_len;
              sVar16._M_str = local_1288._M_str;
              sVar16._M_len = local_1288._M_len;
              sVar15._M_str = local_12f8._M_str;
              sVar15._M_len = local_12f8._M_len;
              sVar14._M_str = local_1368._M_str;
              sVar14._M_len = local_1368._M_len;
              bVar13._M_str = local_e28._M_str;
              bVar13._M_len = local_e28._M_len;
              sVar12._M_str = local_f18._M_str;
              sVar12._M_len = local_f18._M_len;
              sVar11._M_str = local_f88._M_str;
              sVar11._M_len = local_f88._M_len;
              sVar10._M_str = local_ff8._M_str;
              sVar10._M_len = local_ff8._M_len;
              sVar9._M_str = local_1068._M_str;
              sVar9._M_len = local_1068._M_len;
              sVar8._M_str = local_10d8._M_str;
              sVar8._M_len = local_10d8._M_len;
              sVar7._M_str = local_1148._M_str;
              sVar7._M_len = local_1148._M_len;
              sVar6._M_str = local_11b8._M_str;
              sVar6._M_len = local_11b8._M_len;
              sVar5._M_str = local_1228._M_str;
              sVar5._M_len = local_1228._M_len;
              sVar4._M_str = local_1298._M_str;
              sVar4._M_len = local_1298._M_len;
              sVar3._M_str = local_1308._M_str;
              sVar3._M_len = local_1308._M_len;
              sVar2._M_str = local_1378._M_str;
              sVar2._M_len = local_1378._M_len;
              this_local._7_1_ = 0;
              repeat._4_4_ = 1;
              goto LAB_00179228;
            }
            pPVar31 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                      operator->(&this->Impl);
            if (pPVar31->RepeatMode != Never) {
              std::__cxx11::string::operator=
                        ((string *)arg.field_2._8_8_,"At most one \'--repeat\' option may be used.")
              ;
              bVar25._M_str = local_e18._M_str;
              bVar25._M_len = local_e18._M_len;
              sVar24._M_str = local_f08._M_str;
              sVar24._M_len = local_f08._M_len;
              sVar23._M_str = local_f78._M_str;
              sVar23._M_len = local_f78._M_len;
              sVar22._M_str = local_fe8._M_str;
              sVar22._M_len = local_fe8._M_len;
              sVar21._M_str = local_1058._M_str;
              sVar21._M_len = local_1058._M_len;
              sVar20._M_str = local_10c8._M_str;
              sVar20._M_len = local_10c8._M_len;
              sVar19._M_str = local_1138._M_str;
              sVar19._M_len = local_1138._M_len;
              sVar18._M_str = local_11a8._M_str;
              sVar18._M_len = local_11a8._M_len;
              sVar17._M_str = local_1218._M_str;
              sVar17._M_len = local_1218._M_len;
              sVar16._M_str = local_1288._M_str;
              sVar16._M_len = local_1288._M_len;
              sVar15._M_str = local_12f8._M_str;
              sVar15._M_len = local_12f8._M_len;
              sVar14._M_str = local_1368._M_str;
              sVar14._M_len = local_1368._M_len;
              bVar13._M_str = local_e28._M_str;
              bVar13._M_len = local_e28._M_len;
              sVar12._M_str = local_f18._M_str;
              sVar12._M_len = local_f18._M_len;
              sVar11._M_str = local_f88._M_str;
              sVar11._M_len = local_f88._M_len;
              sVar10._M_str = local_ff8._M_str;
              sVar10._M_len = local_ff8._M_len;
              sVar9._M_str = local_1068._M_str;
              sVar9._M_len = local_1068._M_len;
              sVar8._M_str = local_10d8._M_str;
              sVar8._M_len = local_10d8._M_len;
              sVar7._M_str = local_1148._M_str;
              sVar7._M_len = local_1148._M_len;
              sVar6._M_str = local_11b8._M_str;
              sVar6._M_len = local_11b8._M_len;
              sVar5._M_str = local_1228._M_str;
              sVar5._M_len = local_1228._M_len;
              sVar4._M_str = local_1298._M_str;
              sVar4._M_len = local_1298._M_len;
              sVar3._M_str = local_1308._M_str;
              sVar3._M_len = local_1308._M_len;
              sVar2._M_str = local_1378._M_str;
              sVar2._M_len = local_1378._M_len;
              this_local._7_1_ = 0;
              repeat._4_4_ = 1;
              goto LAB_00179228;
            }
            *i = *i + 1;
            cmsys::RegularExpression::RegularExpression
                      ((RegularExpression *)&count,
                       "^(until-fail|until-pass|after-timeout):([0-9]+)$");
            pvVar29 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](args,*i);
            bVar26 = cmsys::RegularExpression::find((RegularExpression *)&count,pvVar29);
            if (bVar26) {
              cmsys::RegularExpression::match_abi_cxx11_((string *)&n,(RegularExpression *)&count,2)
              ;
              local_2a0 = (string *)&n;
              mode = (string *)0x1;
              cmStrToULong(local_2a0,(unsigned_long *)&mode);
              iVar28 = (int)mode;
              pPVar31 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                        operator->(&this->Impl);
              pPVar31->RepeatCount = iVar28;
              pPVar31 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                        operator->(&this->Impl);
              if (1 < pPVar31->RepeatCount) {
                cmsys::RegularExpression::match_abi_cxx11_(&local_2f0,(RegularExpression *)&count,1)
                ;
                local_2d0 = &local_2f0;
                bVar26 = std::operator==(local_2d0,"until-fail");
                if (bVar26) {
                  pPVar31 = std::
                            unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                            operator->(&this->Impl);
                  pPVar31->RepeatMode = UntilFail;
                }
                else {
                  bVar26 = std::operator==(local_2d0,"until-pass");
                  if (bVar26) {
                    pPVar31 = std::
                              unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                              operator->(&this->Impl);
                    pPVar31->RepeatMode = UntilPass;
                  }
                  else {
                    bVar26 = std::operator==(local_2d0,"after-timeout");
                    if (bVar26) {
                      pPVar31 = std::
                                unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                ::operator->(&this->Impl);
                      pPVar31->RepeatMode = AfterTimeout;
                    }
                  }
                }
                std::__cxx11::string::~string((string *)&local_2f0);
              }
              std::__cxx11::string::~string((string *)&n);
              repeat._4_4_ = 0;
            }
            else {
              cmAlphaNum::cmAlphaNum(&local_340,"\'--repeat\' given invalid value \'");
              pvVar29 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](args,*i);
              cmAlphaNum::cmAlphaNum(&local_370,pvVar29);
              cmStrCat<char[2]>(&local_310,&local_340,&local_370,(char (*) [2])0xd6b6e4);
              std::__cxx11::string::operator=((string *)arg.field_2._8_8_,(string *)&local_310);
              std::__cxx11::string::~string((string *)&local_310);
              this_local._7_1_ = 0;
              repeat._4_4_ = 1;
            }
            cmsys::RegularExpression::~RegularExpression((RegularExpression *)&count);
            bVar25._M_str = local_e18._M_str;
            bVar25._M_len = local_e18._M_len;
            sVar24._M_str = local_f08._M_str;
            sVar24._M_len = local_f08._M_len;
            sVar23._M_str = local_f78._M_str;
            sVar23._M_len = local_f78._M_len;
            sVar22._M_str = local_fe8._M_str;
            sVar22._M_len = local_fe8._M_len;
            sVar21._M_str = local_1058._M_str;
            sVar21._M_len = local_1058._M_len;
            sVar20._M_str = local_10c8._M_str;
            sVar20._M_len = local_10c8._M_len;
            sVar19._M_str = local_1138._M_str;
            sVar19._M_len = local_1138._M_len;
            sVar18._M_str = local_11a8._M_str;
            sVar18._M_len = local_11a8._M_len;
            sVar17._M_str = local_1218._M_str;
            sVar17._M_len = local_1218._M_len;
            sVar16._M_str = local_1288._M_str;
            sVar16._M_len = local_1288._M_len;
            sVar15._M_str = local_12f8._M_str;
            sVar15._M_len = local_12f8._M_len;
            sVar14._M_str = local_1368._M_str;
            sVar14._M_len = local_1368._M_len;
            bVar13._M_str = local_e28._M_str;
            bVar13._M_len = local_e28._M_len;
            sVar12._M_str = local_f18._M_str;
            sVar12._M_len = local_f18._M_len;
            sVar11._M_str = local_f88._M_str;
            sVar11._M_len = local_f88._M_len;
            sVar10._M_str = local_ff8._M_str;
            sVar10._M_len = local_ff8._M_len;
            sVar9._M_str = local_1068._M_str;
            sVar9._M_len = local_1068._M_len;
            sVar8._M_str = local_10d8._M_str;
            sVar8._M_len = local_10d8._M_len;
            sVar7._M_str = local_1148._M_str;
            sVar7._M_len = local_1148._M_len;
            sVar6._M_str = local_11b8._M_str;
            sVar6._M_len = local_11b8._M_len;
            sVar5._M_str = local_1228._M_str;
            sVar5._M_len = local_1228._M_len;
            sVar4._M_str = local_1298._M_str;
            sVar4._M_len = local_1298._M_len;
            sVar3._M_str = local_1308._M_str;
            sVar3._M_len = local_1308._M_len;
            sVar2._M_str = local_1378._M_str;
            sVar2._M_len = local_1378._M_len;
joined_r0x001754d1:
            if (repeat._4_4_ != 0) goto LAB_00179228;
          }
          else {
            sVar36 = ::cm::operator____s("--test-load",0xb);
            varg1_02._M_len = sVar36.super_string_view._M_str;
            load = sVar36.super_string_view._M_len;
            varg1_02._M_str = (char *)0x0;
            pcStack_390 = varg1_02._M_len;
            local_388 = (string *)load;
            pcStack_380 = varg1_02._M_len;
            bVar27 = CheckArgument(&local_50,(string *)load,varg1_02,in_R8);
            bVar26 = false;
            if (bVar27) {
              uVar1 = *i;
              sVar32 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(args);
              bVar26 = uVar1 < sVar32 - 1;
            }
            if (bVar26) {
              *i = *i + 1;
              pvVar29 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](args,*i);
              bVar26 = cmStrToULong(pvVar29,&local_3a0);
              if (bVar26) {
                SetTestLoad(this,local_3a0);
              }
              else {
                std::__cxx11::ostringstream::ostringstream((ostringstream *)local_518);
                poVar30 = std::operator<<((ostream *)local_518,"Invalid value for \'Test Load\' : ")
                ;
                pvVar29 = std::
                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          ::operator[](args,*i);
                poVar30 = std::operator<<(poVar30,(string *)pvVar29);
                std::ostream::operator<<(poVar30,std::endl<char,std::char_traits<char>>);
                std::__cxx11::ostringstream::str();
                in_R8 = (char *)std::__cxx11::string::c_str();
                Log(this,6,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                    ,0x7a2,in_R8,false);
                std::__cxx11::string::~string(local_538);
                std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_518);
              }
            }
            else {
              sVar36 = ::cm::operator____s("--no-compress-output",0x14);
              varg1_03._M_len = sVar36.super_string_view._M_str;
              varg1_03._M_str = (char *)0x0;
              bVar26 = CheckArgument(&local_50,(string *)sVar36.super_string_view._M_len,varg1_03,
                                     in_R8);
              if (bVar26) {
                pPVar31 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                          ::operator->(&this->Impl);
                pPVar31->CompressTestOutput = false;
              }
              else {
                sVar36 = ::cm::operator____s("--print-labels",0xe);
                varg1_04._M_len = sVar36.super_string_view._M_str;
                varg1_04._M_str = (char *)0x0;
                bVar26 = CheckArgument(&local_50,(string *)sVar36.super_string_view._M_len,varg1_04,
                                       in_R8);
                if (bVar26) {
                  pPVar31 = std::
                            unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                            operator->(&this->Impl);
                  pPVar31->PrintLabels = true;
                }
                else {
                  sVar36 = ::cm::operator____s("--http1.0",9);
                  varg1_05._M_len = sVar36.super_string_view._M_str;
                  varg1_05._M_str = (char *)0x0;
                  bVar26 = CheckArgument(&local_50,(string *)sVar36.super_string_view._M_len,
                                         varg1_05,in_R8);
                  if (bVar26) {
                    pPVar31 = std::
                              unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                              operator->(&this->Impl);
                    pPVar31->UseHTTP10 = true;
                  }
                  else {
                    sVar36 = ::cm::operator____s("--timeout",9);
                    varg1_06._M_len = sVar36.super_string_view._M_str;
                    timeout.__r = (rep_conflict)sVar36.super_string_view._M_len;
                    varg1_06._M_str = (char *)0x0;
                    bVar27 = CheckArgument(&local_50,(string *)timeout.__r,varg1_06,in_R8);
                    bVar26 = false;
                    if (bVar27) {
                      uVar1 = *i;
                      sVar32 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::size(args);
                      bVar26 = uVar1 < sVar32 - 1;
                    }
                    if (bVar26) {
                      *i = *i + 1;
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](args,*i);
                      pcVar33 = (char *)std::__cxx11::string::c_str();
                      local_5c8 = atof(pcVar33);
                      std::chrono::duration<double,std::ratio<1l,1l>>::duration<double,void>
                                ((duration<double,std::ratio<1l,1l>> *)&local_5c0,&local_5c8);
                      pPVar31 = std::
                                unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                ::operator->(&this->Impl);
                      (pPVar31->GlobalTimeout).__r = local_5c0;
                    }
                    else {
                      local_5e8 = (string_view)::cm::operator____s("--stop-time",0xb);
                      varg1_07._M_len = local_5e8._M_str;
                      varg1_07._M_str = (char *)0x0;
                      local_5d8 = local_5e8;
                      bVar27 = CheckArgument(&local_50,(string *)local_5e8._M_len,varg1_07,in_R8);
                      bVar26 = false;
                      if (bVar27) {
                        uVar1 = *i;
                        sVar32 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::size(args);
                        bVar26 = uVar1 < sVar32 - 1;
                      }
                      if (bVar26) {
                        *i = *i + 1;
                        pvVar29 = std::
                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                  ::operator[](args,*i);
                        SetStopTime(this,pvVar29);
                      }
                      else {
                        local_608 = (string_view)::cm::operator____s("--stop-on-failure",0x11);
                        varg1_08._M_len = local_608._M_str;
                        varg1_08._M_str = (char *)0x0;
                        local_5f8 = local_608;
                        bVar26 = CheckArgument(&local_50,(string *)local_608._M_len,varg1_08,in_R8);
                        if (bVar26) {
                          pPVar31 = std::
                                    unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                    ::operator->(&this->Impl);
                          pPVar31->StopOnFailure = true;
                        }
                        else {
                          local_628 = (string_view)::cm::operator____s("-C",2);
                          varg1_09._M_len = local_628._M_str;
                          varg1_09._M_str = "--build-config";
                          local_618 = local_628;
                          bVar27 = CheckArgument(&local_50,(string *)local_628._M_len,varg1_09,in_R8
                                                );
                          bVar26 = false;
                          if (bVar27) {
                            uVar1 = *i;
                            sVar32 = std::
                                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     ::size(args);
                            bVar26 = uVar1 < sVar32 - 1;
                          }
                          if (bVar26) {
                            *i = *i + 1;
                            pvVar29 = std::
                                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      ::operator[](args,*i);
                            SetConfigType(this,pvVar29);
                          }
                          else {
                            local_648 = (string_view)::cm::operator____s("--debug",7);
                            varg1_10._M_len = local_648._M_str;
                            varg1_10._M_str = (char *)0x0;
                            local_638 = local_648;
                            bVar26 = CheckArgument(&local_50,(string *)local_648._M_len,varg1_10,
                                                   in_R8);
                            if (bVar26) {
                              pPVar31 = std::
                                        unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ::operator->(&this->Impl);
                              pPVar31->Debug = true;
                              pPVar31 = std::
                                        unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                        ::operator->(&this->Impl);
                              pPVar31->ShowLineNumbers = true;
                            }
                            else {
                              local_668 = (string_view)::cm::operator____s("--group",7);
                              varg1_11._M_len = local_668._M_str;
                              varg1_11._M_str = (char *)0x0;
                              local_658 = local_668;
                              bVar26 = CheckArgument(&local_50,(string *)local_668._M_len,varg1_11,
                                                     in_R8);
                              if (bVar26) {
LAB_00175e08:
                                uVar1 = *i;
                                sVar32 = std::
                                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                         ::size(args);
                                bVar26 = uVar1 < sVar32 - 1;
                              }
                              else {
                                local_688 = (string_view)::cm::operator____s("--track",7);
                                varg1_12._M_len = local_688._M_str;
                                varg1_12._M_str = (char *)0x0;
                                local_678 = local_688;
                                bVar27 = CheckArgument(&local_50,(string *)local_688._M_len,varg1_12
                                                       ,in_R8);
                                bVar26 = false;
                                if (bVar27) goto LAB_00175e08;
                              }
                              if (bVar26) {
                                *i = *i + 1;
                                pvVar29 = std::
                                          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                          ::operator[](args,*i);
                                pPVar31 = std::
                                          unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                          ::operator->(&this->Impl);
                                std::__cxx11::string::operator=
                                          ((string *)&pPVar31->SpecificGroup,(string *)pvVar29);
                              }
                              else {
                                local_6a8 = (string_view)
                                            ::cm::operator____s("--show-line-numbers",0x13);
                                varg1_13._M_len = local_6a8._M_str;
                                varg1_13._M_str = (char *)0x0;
                                local_698 = local_6a8;
                                bVar26 = CheckArgument(&local_50,(string *)local_6a8._M_len,varg1_13
                                                       ,in_R8);
                                if (bVar26) {
                                  pPVar31 = std::
                                            unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                            ::operator->(&this->Impl);
                                  pPVar31->ShowLineNumbers = true;
                                }
                                else {
                                  local_6c8 = (string_view)
                                              ::cm::operator____s("--no-label-summary",0x12);
                                  varg1_14._M_len = local_6c8._M_str;
                                  varg1_14._M_str = (char *)0x0;
                                  local_6b8 = local_6c8;
                                  bVar26 = CheckArgument(&local_50,(string *)local_6c8._M_len,
                                                         varg1_14,in_R8);
                                  if (bVar26) {
                                    pPVar31 = std::
                                              unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                              ::operator->(&this->Impl);
                                    pPVar31->LabelSummary = false;
                                  }
                                  else {
                                    local_6e8 = (string_view)
                                                ::cm::operator____s("--no-subproject-summary",0x17);
                                    varg1_15._M_len = local_6e8._M_str;
                                    varg1_15._M_str = (char *)0x0;
                                    local_6d8 = local_6e8;
                                    bVar26 = CheckArgument(&local_50,(string *)local_6e8._M_len,
                                                           varg1_15,in_R8);
                                    if (bVar26) {
                                      pPVar31 = std::
                                                unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                ::operator->(&this->Impl);
                                      pPVar31->SubprojectSummary = false;
                                    }
                                    else {
                                      local_708 = (string_view)::cm::operator____s("-Q",2);
                                      varg1_16._M_len = local_708._M_str;
                                      varg1_16._M_str = "--quiet";
                                      local_6f8 = local_708;
                                      bVar26 = CheckArgument(&local_50,(string *)local_708._M_len,
                                                             varg1_16,in_R8);
                                      if (bVar26) {
                                        pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                        pPVar31->Quiet = true;
                                      }
                                      else {
                                        local_728 = (string_view)
                                                    ::cm::operator____s("--progress",10);
                                        varg1_17._M_len = local_728._M_str;
                                        varg1_17._M_str = (char *)0x0;
                                        local_718 = local_728;
                                        bVar26 = CheckArgument(&local_50,(string *)local_728._M_len,
                                                               varg1_17,in_R8);
                                        if (bVar26) {
                                          pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                          pPVar31->TestProgressOutput = true;
                                        }
                                        else {
                                          local_748 = (string_view)::cm::operator____s("-V",2);
                                          varg1_18._M_len = local_748._M_str;
                                          varg1_18._M_str = "--verbose";
                                          local_738 = local_748;
                                          bVar26 = CheckArgument(&local_50,
                                                                 (string *)local_748._M_len,varg1_18
                                                                 ,in_R8);
                                          if (bVar26) {
                                            pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                            pPVar31->Verbose = true;
                                          }
                                          else {
                                            local_768 = (string_view)::cm::operator____s("-VV",3);
                                            varg1_19._M_len = local_768._M_str;
                                            varg1_19._M_str = "--extra-verbose";
                                            local_758 = local_768;
                                            bVar26 = CheckArgument(&local_50,
                                                                   (string *)local_768._M_len,
                                                                   varg1_19,in_R8);
                                            if (bVar26) {
                                              pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                              pPVar31->ExtraVerbose = true;
                                              pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                              pPVar31->Verbose = true;
                                            }
                                            else {
                                              local_788 = (string_view)
                                                          ::cm::operator____s("--output-on-failure",
                                                                              0x13);
                                              varg1_20._M_len = local_788._M_str;
                                              varg1_20._M_str = (char *)0x0;
                                              local_778 = local_788;
                                              bVar26 = CheckArgument(&local_50,
                                                                     (string *)local_788._M_len,
                                                                     varg1_20,in_R8);
                                              if (bVar26) {
                                                pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                pPVar31->OutputTestOutputOnTestFailure = true;
                                              }
                                              else {
                                                sVar36 = ::cm::operator____s(
                                                  "--test-output-size-passed",0x19);
                                                varg1_21._M_len = sVar36.super_string_view._M_str;
                                                outputSize = sVar36.super_string_view._M_len;
                                                varg1_21._M_str = (char *)0x0;
                                                pcStack_7a0 = varg1_21._M_len;
                                                local_798 = (string *)outputSize;
                                                pcStack_790 = varg1_21._M_len;
                                                bVar27 = CheckArgument(&local_50,
                                                                       (string *)outputSize,varg1_21
                                                                       ,in_R8);
                                                bVar26 = false;
                                                if (bVar27) {
                                                  uVar1 = *i;
                                                  sVar32 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  bVar26 = uVar1 < sVar32 - 1;
                                                }
                                                if (bVar26) {
                                                  *i = *i + 1;
                                                  pvVar29 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  bVar26 = cmStrToLong(pvVar29,(long *)local_7b0);
                                                  if (bVar26) {
                                                    pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  cmCTestTestHandler::SetTestOutputSizePassed
                                                            (&pPVar31->TestHandler,local_7b0[0]);
                                                  }
                                                  else {
                                                    std::__cxx11::ostringstream::ostringstream
                                                              ((ostringstream *)local_928);
                                                    poVar30 = std::operator<<((ostream *)local_928,
                                                                                                                                                            
                                                  "Invalid value for \'--test-output-size-passed\': "
                                                  );
                                                  pvVar29 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  poVar30 = std::operator<<(poVar30,(string *)
                                                                                    pvVar29);
                                                  std::operator<<(poVar30,"\n");
                                                  std::__cxx11::ostringstream::str();
                                                  in_R8 = (char *)std::__cxx11::string::c_str();
                                                  Log(this,6,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                                                  ,0x7ec,in_R8,false);
                                                  std::__cxx11::string::~string(local_948);
                                                  std::__cxx11::ostringstream::~ostringstream
                                                            ((ostringstream *)local_928);
                                                  }
                                                }
                                                else {
                                                  sVar36 = ::cm::operator____s(
                                                  "--test-output-size-failed",0x19);
                                                  varg1_22._M_len = sVar36.super_string_view._M_str;
                                                  outputSize_1 = sVar36.super_string_view._M_len;
                                                  varg1_22._M_str = (char *)0x0;
                                                  pcStack_960 = varg1_22._M_len;
                                                  local_958 = (string *)outputSize_1;
                                                  pcStack_950 = varg1_22._M_len;
                                                  bVar27 = CheckArgument(&local_50,
                                                                         (string *)outputSize_1,
                                                                         varg1_22,in_R8);
                                                  bVar26 = false;
                                                  if (bVar27) {
                                                    uVar1 = *i;
                                                    sVar32 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  bVar26 = uVar1 < sVar32 - 1;
                                                  }
                                                  if (bVar26) {
                                                    *i = *i + 1;
                                                    pvVar29 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  bVar26 = cmStrToLong(pvVar29,(long *)local_970);
                                                  if (bVar26) {
                                                    pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  cmCTestTestHandler::SetTestOutputSizeFailed
                                                            (&pPVar31->TestHandler,local_970[0]);
                                                  }
                                                  else {
                                                    std::__cxx11::ostringstream::ostringstream
                                                              ((ostringstream *)local_ae8);
                                                    poVar30 = std::operator<<((ostream *)local_ae8,
                                                                                                                                                            
                                                  "Invalid value for \'--test-output-size-failed\': "
                                                  );
                                                  pvVar29 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  poVar30 = std::operator<<(poVar30,(string *)
                                                                                    pvVar29);
                                                  std::operator<<(poVar30,"\n");
                                                  std::__cxx11::ostringstream::str();
                                                  in_R8 = (char *)std::__cxx11::string::c_str();
                                                  Log(this,6,
                                                  "/workspace/llm4binary/github/license_all_cmakelists_25/JKorbelRA[P]CMake/Source/cmCTest.cxx"
                                                  ,0x7f8,in_R8,false);
                                                  std::__cxx11::string::~string(local_b08);
                                                  std::__cxx11::ostringstream::~ostringstream
                                                            ((ostringstream *)local_ae8);
                                                  }
                                                  }
                                                  else {
                                                    local_b28 = (string_view)
                                                                ::cm::operator____s(
                                                  "--test-output-truncation",0x18);
                                                  varg1_23._M_len = local_b28._M_str;
                                                  varg1_23._M_str = (char *)0x0;
                                                  local_b18 = local_b28;
                                                  bVar27 = CheckArgument(&local_50,
                                                                         (string *)local_b28._M_len,
                                                                         varg1_23,in_R8);
                                                  bVar26 = false;
                                                  if (bVar27) {
                                                    uVar1 = *i;
                                                    sVar32 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  bVar26 = uVar1 < sVar32 - 1;
                                                  }
                                                  if (bVar26) {
                                                    *i = *i + 1;
                                                    pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pvVar29 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  bVar26 = cmCTestTestHandler::
                                                           SetTestOutputTruncation
                                                                     (&pPVar31->TestHandler,pvVar29)
                                                  ;
                                                  if (!bVar26) {
                                                    pvVar29 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  std::operator+(&local_b48,
                                                                                                                                  
                                                  "Invalid value for \'--test-output-truncation\': "
                                                  ,pvVar29);
                                                  std::__cxx11::string::operator=
                                                            ((string *)arg.field_2._8_8_,
                                                             (string *)&local_b48);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_b48);
                                                  bVar25._M_str = local_e18._M_str;
                                                  bVar25._M_len = local_e18._M_len;
                                                  sVar24._M_str = local_f08._M_str;
                                                  sVar24._M_len = local_f08._M_len;
                                                  sVar23._M_str = local_f78._M_str;
                                                  sVar23._M_len = local_f78._M_len;
                                                  sVar22._M_str = local_fe8._M_str;
                                                  sVar22._M_len = local_fe8._M_len;
                                                  sVar21._M_str = local_1058._M_str;
                                                  sVar21._M_len = local_1058._M_len;
                                                  sVar20._M_str = local_10c8._M_str;
                                                  sVar20._M_len = local_10c8._M_len;
                                                  sVar19._M_str = local_1138._M_str;
                                                  sVar19._M_len = local_1138._M_len;
                                                  sVar18._M_str = local_11a8._M_str;
                                                  sVar18._M_len = local_11a8._M_len;
                                                  sVar17._M_str = local_1218._M_str;
                                                  sVar17._M_len = local_1218._M_len;
                                                  sVar16._M_str = local_1288._M_str;
                                                  sVar16._M_len = local_1288._M_len;
                                                  sVar15._M_str = local_12f8._M_str;
                                                  sVar15._M_len = local_12f8._M_len;
                                                  sVar14._M_str = local_1368._M_str;
                                                  sVar14._M_len = local_1368._M_len;
                                                  bVar13._M_str = local_e28._M_str;
                                                  bVar13._M_len = local_e28._M_len;
                                                  sVar12._M_str = local_f18._M_str;
                                                  sVar12._M_len = local_f18._M_len;
                                                  sVar11._M_str = local_f88._M_str;
                                                  sVar11._M_len = local_f88._M_len;
                                                  sVar10._M_str = local_ff8._M_str;
                                                  sVar10._M_len = local_ff8._M_len;
                                                  sVar9._M_str = local_1068._M_str;
                                                  sVar9._M_len = local_1068._M_len;
                                                  sVar8._M_str = local_10d8._M_str;
                                                  sVar8._M_len = local_10d8._M_len;
                                                  sVar7._M_str = local_1148._M_str;
                                                  sVar7._M_len = local_1148._M_len;
                                                  sVar6._M_str = local_11b8._M_str;
                                                  sVar6._M_len = local_11b8._M_len;
                                                  sVar5._M_str = local_1228._M_str;
                                                  sVar5._M_len = local_1228._M_len;
                                                  sVar4._M_str = local_1298._M_str;
                                                  sVar4._M_len = local_1298._M_len;
                                                  sVar3._M_str = local_1308._M_str;
                                                  sVar3._M_len = local_1308._M_len;
                                                  sVar2._M_str = local_1378._M_str;
                                                  sVar2._M_len = local_1378._M_len;
                                                  this_local._7_1_ = 0;
                                                  repeat._4_4_ = 1;
                                                  goto LAB_00179228;
                                                  }
                                                  }
                                                  else {
                                                    sVar36 = ::cm::operator____s("-N",2);
                                                    varg1_24._M_len =
                                                         sVar36.super_string_view._M_str;
                                                    varg1_24._M_str = "--show-only";
                                                    bVar26 = CheckArgument(&local_50,
                                                                           (string *)
                                                                           sVar36.super_string_view.
                                                                           _M_len,varg1_24,in_R8);
                                                    if (bVar26) {
                                                      pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pPVar31->ShowOnly = true;
                                                  }
                                                  else {
                                                    sVar37 = (string_view)
                                                             std::__cxx11::string::
                                                             operator_cast_to_basic_string_view
                                                                       ((string *)&local_50);
                                                    argWithFormat.field_2._8_8_ = sVar37._M_len;
                                                    bVar26 = cmHasLiteralPrefix<13ul>
                                                                       (sVar37,(char (*) [13])
                                                                               "--show-only=");
                                                    if (bVar26) {
                                                      pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pPVar31->ShowOnly = true;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            (local_b98,"--show-only=",
                                                             (allocator<char> *)
                                                             (format.field_2._M_local_buf + 0xf));
                                                  std::allocator<char>::~allocator
                                                            ((allocator<char> *)
                                                             (format.field_2._M_local_buf + 0xf));
                                                  std::__cxx11::string::length();
                                                  std::__cxx11::string::substr
                                                            ((ulong)local_bc0,(ulong)&local_50);
                                                  bVar26 = std::operator==((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_bc0,"json-v1");
                                                  if (bVar26) {
                                                    pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pPVar31->Quiet = true;
                                                  pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pPVar31->OutputAsJson = true;
                                                  pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pPVar31->OutputAsJsonVersion = 1;
LAB_00176bbb:
                                                  repeat._4_4_ = 0;
                                                  }
                                                  else {
                                                    bVar26 = std::operator!=((
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_bc0,"human");
                                                  if (!bVar26) goto LAB_00176bbb;
                                                  std::operator+(&local_c00,
                                                                                                                                  
                                                  "\'--show-only=\' given unknown value \'",
                                                  (
                                                  basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                                  *)local_bc0);
                                                  std::operator+(&local_be0,&local_c00,"\'");
                                                  std::__cxx11::string::operator=
                                                            ((string *)arg.field_2._8_8_,
                                                             (string *)&local_be0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_be0);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_c00);
                                                  this_local._7_1_ = 0;
                                                  repeat._4_4_ = 1;
                                                  }
                                                  std::__cxx11::string::~string((string *)local_bc0)
                                                  ;
                                                  std::__cxx11::string::~string(local_b98);
                                                  bVar25._M_str = local_e18._M_str;
                                                  bVar25._M_len = local_e18._M_len;
                                                  sVar24._M_str = local_f08._M_str;
                                                  sVar24._M_len = local_f08._M_len;
                                                  sVar23._M_str = local_f78._M_str;
                                                  sVar23._M_len = local_f78._M_len;
                                                  sVar22._M_str = local_fe8._M_str;
                                                  sVar22._M_len = local_fe8._M_len;
                                                  sVar21._M_str = local_1058._M_str;
                                                  sVar21._M_len = local_1058._M_len;
                                                  sVar20._M_str = local_10c8._M_str;
                                                  sVar20._M_len = local_10c8._M_len;
                                                  sVar19._M_str = local_1138._M_str;
                                                  sVar19._M_len = local_1138._M_len;
                                                  sVar18._M_str = local_11a8._M_str;
                                                  sVar18._M_len = local_11a8._M_len;
                                                  sVar17._M_str = local_1218._M_str;
                                                  sVar17._M_len = local_1218._M_len;
                                                  sVar16._M_str = local_1288._M_str;
                                                  sVar16._M_len = local_1288._M_len;
                                                  sVar15._M_str = local_12f8._M_str;
                                                  sVar15._M_len = local_12f8._M_len;
                                                  sVar14._M_str = local_1368._M_str;
                                                  sVar14._M_len = local_1368._M_len;
                                                  bVar13._M_str = local_e28._M_str;
                                                  bVar13._M_len = local_e28._M_len;
                                                  sVar12._M_str = local_f18._M_str;
                                                  sVar12._M_len = local_f18._M_len;
                                                  sVar11._M_str = local_f88._M_str;
                                                  sVar11._M_len = local_f88._M_len;
                                                  sVar10._M_str = local_ff8._M_str;
                                                  sVar10._M_len = local_ff8._M_len;
                                                  sVar9._M_str = local_1068._M_str;
                                                  sVar9._M_len = local_1068._M_len;
                                                  sVar8._M_str = local_10d8._M_str;
                                                  sVar8._M_len = local_10d8._M_len;
                                                  sVar7._M_str = local_1148._M_str;
                                                  sVar7._M_len = local_1148._M_len;
                                                  sVar6._M_str = local_11b8._M_str;
                                                  sVar6._M_len = local_11b8._M_len;
                                                  sVar5._M_str = local_1228._M_str;
                                                  sVar5._M_len = local_1228._M_len;
                                                  sVar4._M_str = local_1298._M_str;
                                                  sVar4._M_len = local_1298._M_len;
                                                  sVar3._M_str = local_1308._M_str;
                                                  sVar3._M_len = local_1308._M_len;
                                                  sVar2._M_str = local_1378._M_str;
                                                  sVar2._M_len = local_1378._M_len;
                                                  goto joined_r0x001754d1;
                                                  }
                                                  local_c28 = (string_view)
                                                              ::cm::operator____s("-O",2);
                                                  varg1_25._M_len = local_c28._M_str;
                                                  varg1_25._M_str = "--output-log";
                                                  local_c18 = local_c28;
                                                  bVar27 = CheckArgument(&local_50,
                                                                         (string *)local_c28._M_len,
                                                                         varg1_25,in_R8);
                                                  bVar26 = false;
                                                  if (bVar27) {
                                                    uVar1 = *i;
                                                    sVar32 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  bVar26 = uVar1 < sVar32 - 1;
                                                  }
                                                  if (bVar26) {
                                                    *i = *i + 1;
                                                    pvVar29 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  SetOutputLogFileName(this,pvVar29);
                                                  }
                                                  else {
                                                    local_c48 = (string_view)
                                                                ::cm::operator____s("--tomorrow-tag"
                                                                                    ,0xe);
                                                    varg1_26._M_len = local_c48._M_str;
                                                    varg1_26._M_str = (char *)0x0;
                                                    local_c38 = local_c48;
                                                    bVar26 = CheckArgument(&local_50,
                                                                           (string *)
                                                                           local_c48._M_len,varg1_26
                                                                           ,in_R8);
                                                    if (bVar26) {
                                                      pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pPVar31->TomorrowTag = true;
                                                  }
                                                  else {
                                                    local_c68 = (string_view)
                                                                ::cm::operator____s(
                                                  "--force-new-ctest-process",0x19);
                                                  varg1_27._M_len = local_c68._M_str;
                                                  varg1_27._M_str = (char *)0x0;
                                                  local_c58 = local_c68;
                                                  bVar26 = CheckArgument(&local_50,
                                                                         (string *)local_c68._M_len,
                                                                         varg1_27,in_R8);
                                                  if (bVar26) {
                                                    pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pPVar31->ForceNewCTestProcess = true;
                                                  }
                                                  else {
                                                    local_c88 = (string_view)
                                                                ::cm::operator____s("-W",2);
                                                    varg1_28._M_len = local_c88._M_str;
                                                    varg1_28._M_str = "--max-width";
                                                    local_c78 = local_c88;
                                                    bVar27 = CheckArgument(&local_50,
                                                                           (string *)
                                                                           local_c88._M_len,varg1_28
                                                                           ,in_R8);
                                                    bVar26 = false;
                                                    if (bVar27) {
                                                      uVar1 = *i;
                                                      sVar32 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  bVar26 = uVar1 < sVar32 - 1;
                                                  }
                                                  if (bVar26) {
                                                    *i = *i + 1;
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  pcVar33 = (char *)std::__cxx11::string::c_str();
                                                  iVar28 = atoi(pcVar33);
                                                  pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pPVar31->MaxTestNameWidth = iVar28;
                                                  }
                                                  else {
                                                    local_ca8 = (string_view)
                                                                ::cm::operator____s(
                                                  "--interactive-debug-mode",0x18);
                                                  varg1_29._M_len = local_ca8._M_str;
                                                  varg1_29._M_str = (char *)0x0;
                                                  local_c98 = local_ca8;
                                                  bVar27 = CheckArgument(&local_50,
                                                                         (string *)local_ca8._M_len,
                                                                         varg1_29,in_R8);
                                                  bVar26 = false;
                                                  if (bVar27) {
                                                    uVar1 = *i;
                                                    sVar32 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  bVar26 = uVar1 < sVar32 - 1;
                                                  }
                                                  if (bVar26) {
                                                    *i = *i + 1;
                                                    pvVar29 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  local_cb8 = (string_view)
                                                              std::__cxx11::string::
                                                              operator_cast_to_basic_string_view
                                                                        ((string *)pvVar29);
                                                  bVar26 = cmIsOn(local_cb8);
                                                  pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pPVar31->InteractiveDebugMode = bVar26;
                                                  }
                                                  else {
                                                    local_cd8 = (string_view)
                                                                ::cm::operator____s("--submit-index"
                                                                                    ,0xe);
                                                    varg1_30._M_len = local_cd8._M_str;
                                                    varg1_30._M_str = (char *)0x0;
                                                    local_cc8 = local_cd8;
                                                    bVar27 = CheckArgument(&local_50,
                                                                           (string *)
                                                                           local_cd8._M_len,varg1_30
                                                                           ,in_R8);
                                                    bVar26 = false;
                                                    if (bVar27) {
                                                      uVar1 = *i;
                                                      sVar32 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  bVar26 = uVar1 < sVar32 - 1;
                                                  }
                                                  if (bVar26) {
                                                    *i = *i + 1;
                                                    std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  pcVar33 = (char *)std::__cxx11::string::c_str();
                                                  iVar28 = atoi(pcVar33);
                                                  pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pPVar31->SubmitIndex = iVar28;
                                                  pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  if (pPVar31->SubmitIndex < 0) {
                                                    pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pPVar31->SubmitIndex = 0;
                                                  }
                                                  }
                                                  else {
                                                    local_cf8 = (string_view)
                                                                ::cm::operator____s("--overwrite",
                                                                                    0xb);
                                                    varg1_31._M_len = local_cf8._M_str;
                                                    varg1_31._M_str = (char *)0x0;
                                                    local_ce8 = local_cf8;
                                                    bVar27 = CheckArgument(&local_50,
                                                                           (string *)
                                                                           local_cf8._M_len,varg1_31
                                                                           ,in_R8);
                                                    bVar26 = false;
                                                    if (bVar27) {
                                                      uVar1 = *i;
                                                      sVar32 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  bVar26 = uVar1 < sVar32 - 1;
                                                  }
                                                  if (bVar26) {
                                                    *i = *i + 1;
                                                    pvVar29 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  AddCTestConfigurationOverwrite(this,pvVar29);
                                                  }
                                                  else {
                                                    local_d18 = (string_view)
                                                                ::cm::operator____s("-A",2);
                                                    varg1_32._M_len = local_d18._M_str;
                                                    varg1_32._M_str = "--add-notes";
                                                    local_d08 = local_d18;
                                                    bVar27 = CheckArgument(&local_50,
                                                                           (string *)
                                                                           local_d18._M_len,varg1_32
                                                                           ,in_R8);
                                                    bVar26 = false;
                                                    if (bVar27) {
                                                      uVar1 = *i;
                                                      sVar32 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  bVar26 = uVar1 < sVar32 - 1;
                                                  }
                                                  if (bVar26) {
                                                    pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  pPVar31->ProduceXML = true;
                                                  std::allocator<char>::allocator();
                                                  std::__cxx11::string::string<std::allocator<char>>
                                                            ((string *)&local_d38,"Notes",&local_d39
                                                            );
                                                  SetTest(this,&local_d38,true);
                                                  std::__cxx11::string::~string
                                                            ((string *)&local_d38);
                                                  std::allocator<char>::~allocator(&local_d39);
                                                  *i = *i + 1;
                                                  pvVar29 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  SetNotesFiles(this,pvVar29);
                                                  bVar25._M_str = local_e18._M_str;
                                                  bVar25._M_len = local_e18._M_len;
                                                  sVar24._M_str = local_f08._M_str;
                                                  sVar24._M_len = local_f08._M_len;
                                                  sVar23._M_str = local_f78._M_str;
                                                  sVar23._M_len = local_f78._M_len;
                                                  sVar22._M_str = local_fe8._M_str;
                                                  sVar22._M_len = local_fe8._M_len;
                                                  sVar21._M_str = local_1058._M_str;
                                                  sVar21._M_len = local_1058._M_len;
                                                  sVar20._M_str = local_10c8._M_str;
                                                  sVar20._M_len = local_10c8._M_len;
                                                  sVar19._M_str = local_1138._M_str;
                                                  sVar19._M_len = local_1138._M_len;
                                                  sVar18._M_str = local_11a8._M_str;
                                                  sVar18._M_len = local_11a8._M_len;
                                                  sVar17._M_str = local_1218._M_str;
                                                  sVar17._M_len = local_1218._M_len;
                                                  sVar16._M_str = local_1288._M_str;
                                                  sVar16._M_len = local_1288._M_len;
                                                  sVar15._M_str = local_12f8._M_str;
                                                  sVar15._M_len = local_12f8._M_len;
                                                  sVar14._M_str = local_1368._M_str;
                                                  sVar14._M_len = local_1368._M_len;
                                                  bVar13._M_str = local_e28._M_str;
                                                  bVar13._M_len = local_e28._M_len;
                                                  sVar12._M_str = local_f18._M_str;
                                                  sVar12._M_len = local_f18._M_len;
                                                  sVar11._M_str = local_f88._M_str;
                                                  sVar11._M_len = local_f88._M_len;
                                                  sVar10._M_str = local_ff8._M_str;
                                                  sVar10._M_len = local_ff8._M_len;
                                                  sVar9._M_str = local_1068._M_str;
                                                  sVar9._M_len = local_1068._M_len;
                                                  sVar8._M_str = local_10d8._M_str;
                                                  sVar8._M_len = local_10d8._M_len;
                                                  sVar7._M_str = local_1148._M_str;
                                                  sVar7._M_len = local_1148._M_len;
                                                  sVar6._M_str = local_11b8._M_str;
                                                  sVar6._M_len = local_11b8._M_len;
                                                  sVar5._M_str = local_1228._M_str;
                                                  sVar5._M_len = local_1228._M_len;
                                                  sVar4._M_str = local_1298._M_str;
                                                  sVar4._M_len = local_1298._M_len;
                                                  sVar3._M_str = local_1308._M_str;
                                                  sVar3._M_len = local_1308._M_len;
                                                  sVar2._M_str = local_1378._M_str;
                                                  sVar2._M_len = local_1378._M_len;
                                                  this_local._7_1_ = 1;
                                                  repeat._4_4_ = 1;
                                                  goto LAB_00179228;
                                                  }
                                                  local_d68 = (string_view)
                                                              ::cm::operator____s("--test-dir",10);
                                                  varg1_33._M_len = local_d68._M_str;
                                                  varg1_33._M_str = (char *)0x0;
                                                  local_d58 = local_d68;
                                                  bVar26 = CheckArgument(&local_50,
                                                                         (string *)local_d68._M_len,
                                                                         varg1_33,in_R8);
                                                  if (bVar26) {
                                                    uVar1 = *i;
                                                    sVar32 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  if (sVar32 - 1 <= uVar1) {
                                                    std::__cxx11::string::operator=
                                                              ((string *)arg.field_2._8_8_,
                                                               "\'--test-dir\' requires an argument"
                                                              );
                                                    bVar25._M_str = local_e18._M_str;
                                                    bVar25._M_len = local_e18._M_len;
                                                    sVar24._M_str = local_f08._M_str;
                                                    sVar24._M_len = local_f08._M_len;
                                                    sVar23._M_str = local_f78._M_str;
                                                    sVar23._M_len = local_f78._M_len;
                                                    sVar22._M_str = local_fe8._M_str;
                                                    sVar22._M_len = local_fe8._M_len;
                                                    sVar21._M_str = local_1058._M_str;
                                                    sVar21._M_len = local_1058._M_len;
                                                    sVar20._M_str = local_10c8._M_str;
                                                    sVar20._M_len = local_10c8._M_len;
                                                    sVar19._M_str = local_1138._M_str;
                                                    sVar19._M_len = local_1138._M_len;
                                                    sVar18._M_str = local_11a8._M_str;
                                                    sVar18._M_len = local_11a8._M_len;
                                                    sVar17._M_str = local_1218._M_str;
                                                    sVar17._M_len = local_1218._M_len;
                                                    sVar16._M_str = local_1288._M_str;
                                                    sVar16._M_len = local_1288._M_len;
                                                    sVar15._M_str = local_12f8._M_str;
                                                    sVar15._M_len = local_12f8._M_len;
                                                    sVar14._M_str = local_1368._M_str;
                                                    sVar14._M_len = local_1368._M_len;
                                                    bVar13._M_str = local_e28._M_str;
                                                    bVar13._M_len = local_e28._M_len;
                                                    sVar12._M_str = local_f18._M_str;
                                                    sVar12._M_len = local_f18._M_len;
                                                    sVar11._M_str = local_f88._M_str;
                                                    sVar11._M_len = local_f88._M_len;
                                                    sVar10._M_str = local_ff8._M_str;
                                                    sVar10._M_len = local_ff8._M_len;
                                                    sVar9._M_str = local_1068._M_str;
                                                    sVar9._M_len = local_1068._M_len;
                                                    sVar8._M_str = local_10d8._M_str;
                                                    sVar8._M_len = local_10d8._M_len;
                                                    sVar7._M_str = local_1148._M_str;
                                                    sVar7._M_len = local_1148._M_len;
                                                    sVar6._M_str = local_11b8._M_str;
                                                    sVar6._M_len = local_11b8._M_len;
                                                    sVar5._M_str = local_1228._M_str;
                                                    sVar5._M_len = local_1228._M_len;
                                                    sVar4._M_str = local_1298._M_str;
                                                    sVar4._M_len = local_1298._M_len;
                                                    sVar3._M_str = local_1308._M_str;
                                                    sVar3._M_len = local_1308._M_len;
                                                    sVar2._M_str = local_1378._M_str;
                                                    sVar2._M_len = local_1378._M_len;
                                                    this_local._7_1_ = 0;
                                                    repeat._4_4_ = 1;
                                                    goto LAB_00179228;
                                                  }
                                                  *i = *i + 1;
                                                  pvVar29 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  std::__cxx11::string::string
                                                            (local_d88,(string *)pvVar29);
                                                  pPVar31 = std::
                                                  unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>
                                                  ::operator->(&this->Impl);
                                                  std::__cxx11::string::operator=
                                                            ((string *)&pPVar31->TestDir,local_d88);
                                                  std::__cxx11::string::~string(local_d88);
                                                  }
                                                  else {
                                                    sVar36 = ::cm::operator____s("--output-junit",
                                                                                 0xe);
                                                    varg1_34._M_len =
                                                         sVar36.super_string_view._M_str;
                                                    varg1_34._M_str = (char *)0x0;
                                                    bVar26 = CheckArgument(&local_50,
                                                                           (string *)
                                                                           sVar36.super_string_view.
                                                                           _M_len,varg1_34,in_R8);
                                                    if (bVar26) {
                                                      uVar1 = *i;
                                                      sVar32 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::size(args);
                                                  if (sVar32 - 1 <= uVar1) {
                                                    std::__cxx11::string::operator=
                                                              ((string *)arg.field_2._8_8_,
                                                                                                                              
                                                  "\'--output-junit\' requires an argument");
                                                  bVar25._M_str = local_e18._M_str;
                                                  bVar25._M_len = local_e18._M_len;
                                                  sVar24._M_str = local_f08._M_str;
                                                  sVar24._M_len = local_f08._M_len;
                                                  sVar23._M_str = local_f78._M_str;
                                                  sVar23._M_len = local_f78._M_len;
                                                  sVar22._M_str = local_fe8._M_str;
                                                  sVar22._M_len = local_fe8._M_len;
                                                  sVar21._M_str = local_1058._M_str;
                                                  sVar21._M_len = local_1058._M_len;
                                                  sVar20._M_str = local_10c8._M_str;
                                                  sVar20._M_len = local_10c8._M_len;
                                                  sVar19._M_str = local_1138._M_str;
                                                  sVar19._M_len = local_1138._M_len;
                                                  sVar18._M_str = local_11a8._M_str;
                                                  sVar18._M_len = local_11a8._M_len;
                                                  sVar17._M_str = local_1218._M_str;
                                                  sVar17._M_len = local_1218._M_len;
                                                  sVar16._M_str = local_1288._M_str;
                                                  sVar16._M_len = local_1288._M_len;
                                                  sVar15._M_str = local_12f8._M_str;
                                                  sVar15._M_len = local_12f8._M_len;
                                                  sVar14._M_str = local_1368._M_str;
                                                  sVar14._M_len = local_1368._M_len;
                                                  bVar13._M_str = local_e28._M_str;
                                                  bVar13._M_len = local_e28._M_len;
                                                  sVar12._M_str = local_f18._M_str;
                                                  sVar12._M_len = local_f18._M_len;
                                                  sVar11._M_str = local_f88._M_str;
                                                  sVar11._M_len = local_f88._M_len;
                                                  sVar10._M_str = local_ff8._M_str;
                                                  sVar10._M_len = local_ff8._M_len;
                                                  sVar9._M_str = local_1068._M_str;
                                                  sVar9._M_len = local_1068._M_len;
                                                  sVar8._M_str = local_10d8._M_str;
                                                  sVar8._M_len = local_10d8._M_len;
                                                  sVar7._M_str = local_1148._M_str;
                                                  sVar7._M_len = local_1148._M_len;
                                                  sVar6._M_str = local_11b8._M_str;
                                                  sVar6._M_len = local_11b8._M_len;
                                                  sVar5._M_str = local_1228._M_str;
                                                  sVar5._M_len = local_1228._M_len;
                                                  sVar4._M_str = local_1298._M_str;
                                                  sVar4._M_len = local_1298._M_len;
                                                  sVar3._M_str = local_1308._M_str;
                                                  sVar3._M_len = local_1308._M_len;
                                                  sVar2._M_str = local_1378._M_str;
                                                  sVar2._M_len = local_1378._M_len;
                                                  this_local._7_1_ = 0;
                                                  repeat._4_4_ = 1;
                                                  goto LAB_00179228;
                                                  }
                                                  *i = *i + 1;
                                                  pvVar29 = std::
                                                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                                  ::operator[](args,*i);
                                                  std::__cxx11::string::string
                                                            ((string *)&noTestsPrefix._M_str,
                                                             (string *)pvVar29);
                                                  SetOutputJUnitFileName
                                                            (this,(string *)&noTestsPrefix._M_str);
                                                  std::__cxx11::string::~string
                                                            ((string *)&noTestsPrefix._M_str);
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view
            ((basic_string_view<char,_std::char_traits<char>_> *)auStack_dd8,"--no-tests=");
  sVar37 = (string_view)
           std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
  noTestsMode._M_str = (char *)auStack_dd8;
  prefix._M_str = (char *)noTestsPrefix._M_len;
  prefix._M_len = (size_t)auStack_dd8;
  bVar26 = cmHasPrefix(sVar37,prefix);
  if (bVar26) {
    local_e18 = (basic_string_view<char,_std::char_traits<char>_>)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)&local_50);
    sVar32 = std::basic_string_view<char,_std::char_traits<char>_>::length
                       ((basic_string_view<char,_std::char_traits<char>_> *)auStack_dd8);
    local_e28 = std::basic_string_view<char,_std::char_traits<char>_>::substr
                          (&local_e18,sVar32,0xffffffffffffffff);
    noTestsMode._M_len = (size_t)local_e28._M_str;
    sStack_e08 = local_e28._M_len;
    std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e38,"error");
    bVar26 = std::operator==(local_e28,local_e38);
    if (bVar26) {
      pPVar31 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                operator->(&this->Impl);
      pPVar31->NoTestsMode = Error;
    }
    else {
      local_e48 = sStack_e08;
      local_e40 = (char *)noTestsMode._M_len;
      std::basic_string_view<char,_std::char_traits<char>_>::basic_string_view(&local_e58,"ignore");
      __x._M_str = local_e40;
      __x._M_len = local_e48;
      bVar26 = std::operator!=(__x,local_e58);
      if (bVar26) {
        cmAlphaNum::cmAlphaNum(&local_ea8,"\'--no-tests=\' given unknown value \'");
        local_ee8 = sStack_e08;
        sStack_ee0 = noTestsMode._M_len;
        view._M_str = (char *)noTestsMode._M_len;
        view._M_len = sStack_e08;
        cmAlphaNum::cmAlphaNum(&local_ed8,view);
        local_ee9 = '\'';
        cmStrCat<char>(&local_e78,&local_ea8,&local_ed8,&local_ee9);
        std::__cxx11::string::operator=((string *)arg.field_2._8_8_,(string *)&local_e78);
        std::__cxx11::string::~string((string *)&local_e78);
        sVar24._M_str = local_f08._M_str;
        sVar24._M_len = local_f08._M_len;
        sVar23._M_str = local_f78._M_str;
        sVar23._M_len = local_f78._M_len;
        sVar22._M_str = local_fe8._M_str;
        sVar22._M_len = local_fe8._M_len;
        sVar21._M_str = local_1058._M_str;
        sVar21._M_len = local_1058._M_len;
        sVar20._M_str = local_10c8._M_str;
        sVar20._M_len = local_10c8._M_len;
        sVar19._M_str = local_1138._M_str;
        sVar19._M_len = local_1138._M_len;
        sVar18._M_str = local_11a8._M_str;
        sVar18._M_len = local_11a8._M_len;
        sVar17._M_str = local_1218._M_str;
        sVar17._M_len = local_1218._M_len;
        sVar16._M_str = local_1288._M_str;
        sVar16._M_len = local_1288._M_len;
        sVar15._M_str = local_12f8._M_str;
        sVar15._M_len = local_12f8._M_len;
        sVar14._M_str = local_1368._M_str;
        sVar14._M_len = local_1368._M_len;
        sVar12._M_str = local_f18._M_str;
        sVar12._M_len = local_f18._M_len;
        sVar11._M_str = local_f88._M_str;
        sVar11._M_len = local_f88._M_len;
        sVar10._M_str = local_ff8._M_str;
        sVar10._M_len = local_ff8._M_len;
        sVar9._M_str = local_1068._M_str;
        sVar9._M_len = local_1068._M_len;
        sVar8._M_str = local_10d8._M_str;
        sVar8._M_len = local_10d8._M_len;
        sVar7._M_str = local_1148._M_str;
        sVar7._M_len = local_1148._M_len;
        sVar6._M_str = local_11b8._M_str;
        sVar6._M_len = local_11b8._M_len;
        sVar5._M_str = local_1228._M_str;
        sVar5._M_len = local_1228._M_len;
        sVar4._M_str = local_1298._M_str;
        sVar4._M_len = local_1298._M_len;
        sVar3._M_str = local_1308._M_str;
        sVar3._M_len = local_1308._M_len;
        sVar2._M_str = local_1378._M_str;
        sVar2._M_len = local_1378._M_len;
        this_local._7_1_ = 0;
        repeat._4_4_ = 1;
        bVar13 = local_e28;
        bVar25 = local_e18;
        goto LAB_00179228;
      }
      pPVar31 = std::unique_ptr<cmCTest::Private,_std::default_delete<cmCTest::Private>_>::
                operator->(&this->Impl);
      pPVar31->NoTestsMode = Ignore;
    }
  }
  else {
    local_f18 = (string_view)::cm::operator____s("-I",2);
    varg1_35._M_len = local_f18._M_str;
    varg1_35._M_str = "--tests-information";
    local_f08 = local_f18;
    bVar27 = CheckArgument(&local_50,(string *)local_f18._M_len,varg1_35,in_R8);
    bVar26 = false;
    if (bVar27) {
      uVar1 = *i;
      sVar32 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::size(args);
      bVar26 = uVar1 < sVar32 - 1;
    }
    if (bVar26) {
      *i = *i + 1;
      pcVar34 = GetTestHandler(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f38,"TestsToRunInformation",&local_f39);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,*i);
      pcVar33 = (char *)std::__cxx11::string::c_str();
      cmCTestGenericHandler::SetPersistentOption
                (&pcVar34->super_cmCTestGenericHandler,&local_f38,pcVar33);
      std::__cxx11::string::~string((string *)&local_f38);
      std::allocator<char>::~allocator(&local_f39);
      pcVar35 = GetMemCheckHandler(this);
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_f60,"TestsToRunInformation",&local_f61);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::operator[](args,*i);
      pcVar33 = (char *)std::__cxx11::string::c_str();
      cmCTestGenericHandler::SetPersistentOption
                ((cmCTestGenericHandler *)pcVar35,&local_f60,pcVar33);
      std::__cxx11::string::~string((string *)&local_f60);
      std::allocator<char>::~allocator(&local_f61);
    }
    else {
      local_f88 = (string_view)::cm::operator____s("-U",2);
      varg1_36._M_len = local_f88._M_str;
      varg1_36._M_str = "--union";
      local_f78 = local_f88;
      bVar26 = CheckArgument(&local_50,(string *)local_f88._M_len,varg1_36,in_R8);
      if (bVar26) {
        pcVar34 = GetTestHandler(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_fa8,"UseUnion",&local_fa9);
        cmCTestGenericHandler::SetPersistentOption
                  (&pcVar34->super_cmCTestGenericHandler,&local_fa8,"true");
        std::__cxx11::string::~string((string *)&local_fa8);
        std::allocator<char>::~allocator(&local_fa9);
        pcVar35 = GetMemCheckHandler(this);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_fd0,"UseUnion",&local_fd1);
        cmCTestGenericHandler::SetPersistentOption
                  ((cmCTestGenericHandler *)pcVar35,&local_fd0,"true");
        std::__cxx11::string::~string((string *)&local_fd0);
        std::allocator<char>::~allocator(&local_fd1);
      }
      else {
        local_ff8 = (string_view)::cm::operator____s("-R",2);
        varg1_37._M_len = local_ff8._M_str;
        varg1_37._M_str = "--tests-regex";
        local_fe8 = local_ff8;
        bVar27 = CheckArgument(&local_50,(string *)local_ff8._M_len,varg1_37,in_R8);
        bVar26 = false;
        if (bVar27) {
          uVar1 = *i;
          sVar32 = std::
                   vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ::size(args);
          bVar26 = uVar1 < sVar32 - 1;
        }
        if (bVar26) {
          *i = *i + 1;
          pcVar34 = GetTestHandler(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1018,"IncludeRegularExpression",&local_1019);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](args,*i);
          pcVar33 = (char *)std::__cxx11::string::c_str();
          cmCTestGenericHandler::SetPersistentOption
                    (&pcVar34->super_cmCTestGenericHandler,&local_1018,pcVar33);
          std::__cxx11::string::~string((string *)&local_1018);
          std::allocator<char>::~allocator(&local_1019);
          pcVar35 = GetMemCheckHandler(this);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1040,"IncludeRegularExpression",&local_1041);
          std::
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[](args,*i);
          pcVar33 = (char *)std::__cxx11::string::c_str();
          cmCTestGenericHandler::SetPersistentOption
                    ((cmCTestGenericHandler *)pcVar35,&local_1040,pcVar33);
          std::__cxx11::string::~string((string *)&local_1040);
          std::allocator<char>::~allocator(&local_1041);
        }
        else {
          local_1068 = (string_view)::cm::operator____s("-L",2);
          varg1_38._M_len = local_1068._M_str;
          varg1_38._M_str = "--label-regex";
          local_1058 = local_1068;
          bVar27 = CheckArgument(&local_50,(string *)local_1068._M_len,varg1_38,in_R8);
          bVar26 = false;
          if (bVar27) {
            uVar1 = *i;
            sVar32 = std::
                     vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::size(args);
            bVar26 = uVar1 < sVar32 - 1;
          }
          if (bVar26) {
            *i = *i + 1;
            pcVar34 = GetTestHandler(this);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1088,"LabelRegularExpression",&local_1089);
            pvVar29 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](args,*i);
            cmCTestGenericHandler::AddPersistentMultiOption
                      (&pcVar34->super_cmCTestGenericHandler,&local_1088,pvVar29);
            std::__cxx11::string::~string((string *)&local_1088);
            std::allocator<char>::~allocator(&local_1089);
            pcVar35 = GetMemCheckHandler(this);
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_10b0,"LabelRegularExpression",&local_10b1);
            pvVar29 = std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](args,*i);
            cmCTestGenericHandler::AddPersistentMultiOption
                      ((cmCTestGenericHandler *)pcVar35,&local_10b0,pvVar29);
            std::__cxx11::string::~string((string *)&local_10b0);
            std::allocator<char>::~allocator(&local_10b1);
          }
          else {
            local_10d8 = (string_view)::cm::operator____s("-LE",3);
            varg1_39._M_len = local_10d8._M_str;
            varg1_39._M_str = "--label-exclude";
            local_10c8 = local_10d8;
            bVar27 = CheckArgument(&local_50,(string *)local_10d8._M_len,varg1_39,in_R8);
            bVar26 = false;
            if (bVar27) {
              uVar1 = *i;
              sVar32 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::size(args);
              bVar26 = uVar1 < sVar32 - 1;
            }
            if (bVar26) {
              *i = *i + 1;
              pcVar34 = GetTestHandler(this);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_10f8,"ExcludeLabelRegularExpression",&local_10f9);
              pvVar29 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](args,*i);
              cmCTestGenericHandler::AddPersistentMultiOption
                        (&pcVar34->super_cmCTestGenericHandler,&local_10f8,pvVar29);
              std::__cxx11::string::~string((string *)&local_10f8);
              std::allocator<char>::~allocator(&local_10f9);
              pcVar35 = GetMemCheckHandler(this);
              std::allocator<char>::allocator();
              std::__cxx11::string::string<std::allocator<char>>
                        ((string *)&local_1120,"ExcludeLabelRegularExpression",&local_1121);
              pvVar29 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](args,*i);
              cmCTestGenericHandler::AddPersistentMultiOption
                        ((cmCTestGenericHandler *)pcVar35,&local_1120,pvVar29);
              std::__cxx11::string::~string((string *)&local_1120);
              std::allocator<char>::~allocator(&local_1121);
            }
            else {
              local_1148 = (string_view)::cm::operator____s("-E",2);
              varg1_40._M_len = local_1148._M_str;
              varg1_40._M_str = "--exclude-regex";
              local_1138 = local_1148;
              bVar27 = CheckArgument(&local_50,(string *)local_1148._M_len,varg1_40,in_R8);
              bVar26 = false;
              if (bVar27) {
                uVar1 = *i;
                sVar32 = std::
                         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         ::size(args);
                bVar26 = uVar1 < sVar32 - 1;
              }
              if (bVar26) {
                *i = *i + 1;
                pcVar34 = GetTestHandler(this);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1168,"ExcludeRegularExpression",&local_1169);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](args,*i);
                pcVar33 = (char *)std::__cxx11::string::c_str();
                cmCTestGenericHandler::SetPersistentOption
                          (&pcVar34->super_cmCTestGenericHandler,&local_1168,pcVar33);
                std::__cxx11::string::~string((string *)&local_1168);
                std::allocator<char>::~allocator(&local_1169);
                pcVar35 = GetMemCheckHandler(this);
                std::allocator<char>::allocator();
                std::__cxx11::string::string<std::allocator<char>>
                          ((string *)&local_1190,"ExcludeRegularExpression",&local_1191);
                std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::operator[](args,*i);
                pcVar33 = (char *)std::__cxx11::string::c_str();
                cmCTestGenericHandler::SetPersistentOption
                          ((cmCTestGenericHandler *)pcVar35,&local_1190,pcVar33);
                std::__cxx11::string::~string((string *)&local_1190);
                std::allocator<char>::~allocator(&local_1191);
              }
              else {
                local_11b8 = (string_view)::cm::operator____s("-FA",3);
                varg1_41._M_len = local_11b8._M_str;
                varg1_41._M_str = "--fixture-exclude-any";
                local_11a8 = local_11b8;
                bVar27 = CheckArgument(&local_50,(string *)local_11b8._M_len,varg1_41,in_R8);
                bVar26 = false;
                if (bVar27) {
                  uVar1 = *i;
                  sVar32 = std::
                           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                           ::size(args);
                  bVar26 = uVar1 < sVar32 - 1;
                }
                if (bVar26) {
                  *i = *i + 1;
                  pcVar34 = GetTestHandler(this);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_11d8,"ExcludeFixtureRegularExpression",&local_11d9);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](args,*i);
                  pcVar33 = (char *)std::__cxx11::string::c_str();
                  cmCTestGenericHandler::SetPersistentOption
                            (&pcVar34->super_cmCTestGenericHandler,&local_11d8,pcVar33);
                  std::__cxx11::string::~string((string *)&local_11d8);
                  std::allocator<char>::~allocator(&local_11d9);
                  pcVar35 = GetMemCheckHandler(this);
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string<std::allocator<char>>
                            ((string *)&local_1200,"ExcludeFixtureRegularExpression",&local_1201);
                  std::
                  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ::operator[](args,*i);
                  pcVar33 = (char *)std::__cxx11::string::c_str();
                  cmCTestGenericHandler::SetPersistentOption
                            ((cmCTestGenericHandler *)pcVar35,&local_1200,pcVar33);
                  std::__cxx11::string::~string((string *)&local_1200);
                  std::allocator<char>::~allocator(&local_1201);
                }
                else {
                  local_1228 = (string_view)::cm::operator____s("-FS",3);
                  varg1_42._M_len = local_1228._M_str;
                  varg1_42._M_str = "--fixture-exclude-setup";
                  local_1218 = local_1228;
                  bVar27 = CheckArgument(&local_50,(string *)local_1228._M_len,varg1_42,in_R8);
                  bVar26 = false;
                  if (bVar27) {
                    uVar1 = *i;
                    sVar32 = std::
                             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                             ::size(args);
                    bVar26 = uVar1 < sVar32 - 1;
                  }
                  if (bVar26) {
                    *i = *i + 1;
                    pcVar34 = GetTestHandler(this);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1248,"ExcludeFixtureSetupRegularExpression",
                               &local_1249);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](args,*i);
                    pcVar33 = (char *)std::__cxx11::string::c_str();
                    cmCTestGenericHandler::SetPersistentOption
                              (&pcVar34->super_cmCTestGenericHandler,&local_1248,pcVar33);
                    std::__cxx11::string::~string((string *)&local_1248);
                    std::allocator<char>::~allocator(&local_1249);
                    pcVar35 = GetMemCheckHandler(this);
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string<std::allocator<char>>
                              ((string *)&local_1270,"ExcludeFixtureSetupRegularExpression",
                               &local_1271);
                    std::
                    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    ::operator[](args,*i);
                    pcVar33 = (char *)std::__cxx11::string::c_str();
                    cmCTestGenericHandler::SetPersistentOption
                              ((cmCTestGenericHandler *)pcVar35,&local_1270,pcVar33);
                    std::__cxx11::string::~string((string *)&local_1270);
                    std::allocator<char>::~allocator(&local_1271);
                  }
                  else {
                    local_1298 = (string_view)::cm::operator____s("-FC",3);
                    varg1_43._M_len = local_1298._M_str;
                    varg1_43._M_str = "--fixture-exclude-cleanup";
                    local_1288 = local_1298;
                    bVar27 = CheckArgument(&local_50,(string *)local_1298._M_len,varg1_43,in_R8);
                    bVar26 = false;
                    if (bVar27) {
                      uVar1 = *i;
                      sVar32 = std::
                               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                               ::size(args);
                      bVar26 = uVar1 < sVar32 - 1;
                    }
                    if (bVar26) {
                      *i = *i + 1;
                      pcVar34 = GetTestHandler(this);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_12b8,"ExcludeFixtureCleanupRegularExpression",
                                 &local_12b9);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](args,*i);
                      pcVar33 = (char *)std::__cxx11::string::c_str();
                      cmCTestGenericHandler::SetPersistentOption
                                (&pcVar34->super_cmCTestGenericHandler,&local_12b8,pcVar33);
                      std::__cxx11::string::~string((string *)&local_12b8);
                      std::allocator<char>::~allocator(&local_12b9);
                      pcVar35 = GetMemCheckHandler(this);
                      std::allocator<char>::allocator();
                      std::__cxx11::string::string<std::allocator<char>>
                                ((string *)&local_12e0,"ExcludeFixtureCleanupRegularExpression",
                                 &local_12e1);
                      std::
                      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ::operator[](args,*i);
                      pcVar33 = (char *)std::__cxx11::string::c_str();
                      cmCTestGenericHandler::SetPersistentOption
                                ((cmCTestGenericHandler *)pcVar35,&local_12e0,pcVar33);
                      std::__cxx11::string::~string((string *)&local_12e0);
                      std::allocator<char>::~allocator(&local_12e1);
                    }
                    else {
                      local_1308 = (string_view)::cm::operator____s("--resource-spec-file",0x14);
                      varg1_44._M_len = local_1308._M_str;
                      varg1_44._M_str = (char *)0x0;
                      local_12f8 = local_1308;
                      bVar27 = CheckArgument(&local_50,(string *)local_1308._M_len,varg1_44,in_R8);
                      bVar26 = false;
                      if (bVar27) {
                        uVar1 = *i;
                        sVar32 = std::
                                 vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                 ::size(args);
                        bVar26 = uVar1 < sVar32 - 1;
                      }
                      if (bVar26) {
                        *i = *i + 1;
                        pcVar34 = GetTestHandler(this);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_1328,"ResourceSpecFile",&local_1329);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](args,*i);
                        pcVar33 = (char *)std::__cxx11::string::c_str();
                        cmCTestGenericHandler::SetPersistentOption
                                  (&pcVar34->super_cmCTestGenericHandler,&local_1328,pcVar33);
                        std::__cxx11::string::~string((string *)&local_1328);
                        std::allocator<char>::~allocator(&local_1329);
                        pcVar35 = GetMemCheckHandler(this);
                        std::allocator<char>::allocator();
                        std::__cxx11::string::string<std::allocator<char>>
                                  ((string *)&local_1350,"ResourceSpecFile",&local_1351);
                        std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::operator[](args,*i);
                        pcVar33 = (char *)std::__cxx11::string::c_str();
                        cmCTestGenericHandler::SetPersistentOption
                                  ((cmCTestGenericHandler *)pcVar35,&local_1350,pcVar33);
                        std::__cxx11::string::~string((string *)&local_1350);
                        std::allocator<char>::~allocator(&local_1351);
                      }
                      else {
                        local_1378 = (string_view)::cm::operator____s("--rerun-failed",0xe);
                        varg1_45._M_len = local_1378._M_str;
                        varg1_45._M_str = (char *)0x0;
                        local_1368 = local_1378;
                        bVar26 = CheckArgument(&local_50,(string *)local_1378._M_len,varg1_45,in_R8)
                        ;
                        if (bVar26) {
                          pcVar34 = GetTestHandler(this);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_1398,"RerunFailed",&local_1399);
                          cmCTestGenericHandler::SetPersistentOption
                                    (&pcVar34->super_cmCTestGenericHandler,&local_1398,"true");
                          std::__cxx11::string::~string((string *)&local_1398);
                          std::allocator<char>::~allocator(&local_1399);
                          pcVar35 = GetMemCheckHandler(this);
                          std::allocator<char>::allocator();
                          std::__cxx11::string::string<std::allocator<char>>
                                    ((string *)&local_13c0,"RerunFailed",&local_13c1);
                          cmCTestGenericHandler::SetPersistentOption
                                    ((cmCTestGenericHandler *)pcVar35,&local_13c0,"true");
                          std::__cxx11::string::~string((string *)&local_13c0);
                          std::allocator<char>::~allocator(&local_13c1);
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
  this_local._7_1_ = 1;
  repeat._4_4_ = 1;
  sVar2 = local_1378;
  sVar3 = local_1308;
  sVar4 = local_1298;
  sVar5 = local_1228;
  sVar6 = local_11b8;
  sVar7 = local_1148;
  sVar8 = local_10d8;
  sVar9 = local_1068;
  sVar10 = local_ff8;
  sVar11 = local_f88;
  sVar12 = local_f18;
  bVar13 = local_e28;
  sVar14 = local_1368;
  sVar15 = local_12f8;
  sVar16 = local_1288;
  sVar17 = local_1218;
  sVar18 = local_11a8;
  sVar19 = local_1138;
  sVar20 = local_10c8;
  sVar21 = local_1058;
  sVar22 = local_fe8;
  sVar23 = local_f78;
  sVar24 = local_f08;
  bVar25 = local_e18;
LAB_00179228:
  local_1378 = sVar2;
  local_1308 = sVar3;
  local_1298 = sVar4;
  local_1228 = sVar5;
  local_11b8 = sVar6;
  local_1148 = sVar7;
  local_10d8 = sVar8;
  local_1068 = sVar9;
  local_ff8 = sVar10;
  local_f88 = sVar11;
  local_f18 = sVar12;
  local_e28 = bVar13;
  local_1368 = sVar14;
  local_12f8 = sVar15;
  local_1288 = sVar16;
  local_1218 = sVar17;
  local_11a8 = sVar18;
  local_1138 = sVar19;
  local_10c8 = sVar20;
  local_1058 = sVar21;
  local_fe8 = sVar22;
  local_f78 = sVar23;
  local_f08 = sVar24;
  local_e18 = bVar25;
  std::__cxx11::string::~string((string *)&local_50);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTest::HandleCommandLineArguments(size_t& i,
                                         std::vector<std::string>& args,
                                         std::string& errormsg)
{
  std::string arg = args[i];
  if (this->CheckArgument(arg, "-F"_s)) {
    this->Impl->Failover = true;
  } else if (this->CheckArgument(arg, "-j"_s, "--parallel") &&
             i < args.size() - 1) {
    i++;
    int plevel = atoi(args[i].c_str());
    this->SetParallelLevel(plevel);
    this->Impl->ParallelLevelSetInCli = true;
  } else if (cmHasPrefix(arg, "-j")) {
    int plevel = atoi(arg.substr(2).c_str());
    this->SetParallelLevel(plevel);
    this->Impl->ParallelLevelSetInCli = true;
  }

  else if (this->CheckArgument(arg, "--repeat-until-fail"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--repeat-until-fail' requires an argument";
      return false;
    }
    if (this->Impl->RepeatMode != cmCTest::Repeat::Never) {
      errormsg = "At most one '--repeat' option may be used.";
      return false;
    }
    i++;
    long repeat = 1;
    if (!cmStrToLong(args[i], &repeat)) {
      errormsg = cmStrCat("'--repeat-until-fail' given non-integer value '",
                          args[i], "'");
      return false;
    }
    this->Impl->RepeatCount = static_cast<int>(repeat);
    if (repeat > 1) {
      this->Impl->RepeatMode = cmCTest::Repeat::UntilFail;
    }
  }

  else if (this->CheckArgument(arg, "--repeat"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--repeat' requires an argument";
      return false;
    }
    if (this->Impl->RepeatMode != cmCTest::Repeat::Never) {
      errormsg = "At most one '--repeat' option may be used.";
      return false;
    }
    i++;
    cmsys::RegularExpression repeatRegex(
      "^(until-fail|until-pass|after-timeout):([0-9]+)$");
    if (repeatRegex.find(args[i])) {
      std::string const& count = repeatRegex.match(2);
      unsigned long n = 1;
      cmStrToULong(count, &n); // regex guarantees success
      this->Impl->RepeatCount = static_cast<int>(n);
      if (this->Impl->RepeatCount > 1) {
        std::string const& mode = repeatRegex.match(1);
        if (mode == "until-fail") {
          this->Impl->RepeatMode = cmCTest::Repeat::UntilFail;
        } else if (mode == "until-pass") {
          this->Impl->RepeatMode = cmCTest::Repeat::UntilPass;
        } else if (mode == "after-timeout") {
          this->Impl->RepeatMode = cmCTest::Repeat::AfterTimeout;
        }
      }
    } else {
      errormsg = cmStrCat("'--repeat' given invalid value '", args[i], "'");
      return false;
    }
  }

  else if (this->CheckArgument(arg, "--test-load"_s) && i < args.size() - 1) {
    i++;
    unsigned long load;
    if (cmStrToULong(args[i], &load)) {
      this->SetTestLoad(load);
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for 'Test Load' : " << args[i] << std::endl);
    }
  }

  else if (this->CheckArgument(arg, "--no-compress-output"_s)) {
    this->Impl->CompressTestOutput = false;
  }

  else if (this->CheckArgument(arg, "--print-labels"_s)) {
    this->Impl->PrintLabels = true;
  }

  else if (this->CheckArgument(arg, "--http1.0"_s)) {
    this->Impl->UseHTTP10 = true;
  }

  else if (this->CheckArgument(arg, "--timeout"_s) && i < args.size() - 1) {
    i++;
    auto timeout = cmDuration(atof(args[i].c_str()));
    this->Impl->GlobalTimeout = timeout;
  }

  else if (this->CheckArgument(arg, "--stop-time"_s) && i < args.size() - 1) {
    i++;
    this->SetStopTime(args[i]);
  }

  else if (this->CheckArgument(arg, "--stop-on-failure"_s)) {
    this->Impl->StopOnFailure = true;
  }

  else if (this->CheckArgument(arg, "-C"_s, "--build-config") &&
           i < args.size() - 1) {
    i++;
    this->SetConfigType(args[i]);
  }

  else if (this->CheckArgument(arg, "--debug"_s)) {
    this->Impl->Debug = true;
    this->Impl->ShowLineNumbers = true;
  } else if ((this->CheckArgument(arg, "--group"_s) ||
              // This is an undocumented / deprecated option.
              // "Track" has been renamed to "Group".
              this->CheckArgument(arg, "--track"_s)) &&
             i < args.size() - 1) {
    i++;
    this->Impl->SpecificGroup = args[i];
  } else if (this->CheckArgument(arg, "--show-line-numbers"_s)) {
    this->Impl->ShowLineNumbers = true;
  } else if (this->CheckArgument(arg, "--no-label-summary"_s)) {
    this->Impl->LabelSummary = false;
  } else if (this->CheckArgument(arg, "--no-subproject-summary"_s)) {
    this->Impl->SubprojectSummary = false;
  } else if (this->CheckArgument(arg, "-Q"_s, "--quiet")) {
    this->Impl->Quiet = true;
  } else if (this->CheckArgument(arg, "--progress"_s)) {
    this->Impl->TestProgressOutput = true;
  } else if (this->CheckArgument(arg, "-V"_s, "--verbose")) {
    this->Impl->Verbose = true;
  } else if (this->CheckArgument(arg, "-VV"_s, "--extra-verbose")) {
    this->Impl->ExtraVerbose = true;
    this->Impl->Verbose = true;
  } else if (this->CheckArgument(arg, "--output-on-failure"_s)) {
    this->Impl->OutputTestOutputOnTestFailure = true;
  } else if (this->CheckArgument(arg, "--test-output-size-passed"_s) &&
             i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmStrToLong(args[i], &outputSize)) {
      this->Impl->TestHandler.SetTestOutputSizePassed(
        static_cast<int>(outputSize));
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-passed': " << args[i]
                                                                   << "\n");
    }
  } else if (this->CheckArgument(arg, "--test-output-size-failed"_s) &&
             i < args.size() - 1) {
    i++;
    long outputSize;
    if (cmStrToLong(args[i], &outputSize)) {
      this->Impl->TestHandler.SetTestOutputSizeFailed(
        static_cast<int>(outputSize));
    } else {
      cmCTestLog(this, WARNING,
                 "Invalid value for '--test-output-size-failed': " << args[i]
                                                                   << "\n");
    }
  } else if (this->CheckArgument(arg, "--test-output-truncation"_s) &&
             i < args.size() - 1) {
    i++;
    if (!this->Impl->TestHandler.SetTestOutputTruncation(args[i])) {
      errormsg = "Invalid value for '--test-output-truncation': " + args[i];
      return false;
    }
  } else if (this->CheckArgument(arg, "-N"_s, "--show-only")) {
    this->Impl->ShowOnly = true;
  } else if (cmHasLiteralPrefix(arg, "--show-only=")) {
    this->Impl->ShowOnly = true;

    // Check if a specific format is requested. Defaults to human readable
    // text.
    std::string argWithFormat = "--show-only=";
    std::string format = arg.substr(argWithFormat.length());
    if (format == "json-v1") {
      // Force quiet mode so the only output is the json object model.
      this->Impl->Quiet = true;
      this->Impl->OutputAsJson = true;
      this->Impl->OutputAsJsonVersion = 1;
    } else if (format != "human") {
      errormsg = "'--show-only=' given unknown value '" + format + "'";
      return false;
    }
  }

  else if (this->CheckArgument(arg, "-O"_s, "--output-log") &&
           i < args.size() - 1) {
    i++;
    this->SetOutputLogFileName(args[i]);
  }

  else if (this->CheckArgument(arg, "--tomorrow-tag"_s)) {
    this->Impl->TomorrowTag = true;
  } else if (this->CheckArgument(arg, "--force-new-ctest-process"_s)) {
    this->Impl->ForceNewCTestProcess = true;
  } else if (this->CheckArgument(arg, "-W"_s, "--max-width") &&
             i < args.size() - 1) {
    i++;
    this->Impl->MaxTestNameWidth = atoi(args[i].c_str());
  } else if (this->CheckArgument(arg, "--interactive-debug-mode"_s) &&
             i < args.size() - 1) {
    i++;
    this->Impl->InteractiveDebugMode = cmIsOn(args[i]);
  } else if (this->CheckArgument(arg, "--submit-index"_s) &&
             i < args.size() - 1) {
    i++;
    this->Impl->SubmitIndex = atoi(args[i].c_str());
    if (this->Impl->SubmitIndex < 0) {
      this->Impl->SubmitIndex = 0;
    }
  }

  else if (this->CheckArgument(arg, "--overwrite"_s) && i < args.size() - 1) {
    i++;
    this->AddCTestConfigurationOverwrite(args[i]);
  } else if (this->CheckArgument(arg, "-A"_s, "--add-notes") &&
             i < args.size() - 1) {
    this->Impl->ProduceXML = true;
    this->SetTest("Notes");
    i++;
    this->SetNotesFiles(args[i]);
    return true;
  } else if (this->CheckArgument(arg, "--test-dir"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--test-dir' requires an argument";
      return false;
    }
    i++;
    this->Impl->TestDir = std::string(args[i]);
  } else if (this->CheckArgument(arg, "--output-junit"_s)) {
    if (i >= args.size() - 1) {
      errormsg = "'--output-junit' requires an argument";
      return false;
    }
    i++;
    this->SetOutputJUnitFileName(std::string(args[i]));
  }

  cm::string_view noTestsPrefix = "--no-tests=";
  if (cmHasPrefix(arg, noTestsPrefix)) {
    cm::string_view noTestsMode =
      cm::string_view(arg).substr(noTestsPrefix.length());
    if (noTestsMode == "error") {
      this->Impl->NoTestsMode = cmCTest::NoTests::Error;
    } else if (noTestsMode != "ignore") {
      errormsg =
        cmStrCat("'--no-tests=' given unknown value '", noTestsMode, '\'');
      return false;
    } else {
      this->Impl->NoTestsMode = cmCTest::NoTests::Ignore;
    }
  }

  // options that control what tests are run
  else if (this->CheckArgument(arg, "-I"_s, "--tests-information") &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("TestsToRunInformation",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("TestsToRunInformation",
                                                    args[i].c_str());
  } else if (this->CheckArgument(arg, "-U"_s, "--union")) {
    this->GetTestHandler()->SetPersistentOption("UseUnion", "true");
    this->GetMemCheckHandler()->SetPersistentOption("UseUnion", "true");
  } else if (this->CheckArgument(arg, "-R"_s, "--tests-regex") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("IncludeRegularExpression",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("IncludeRegularExpression",
                                                    args[i].c_str());
  } else if (this->CheckArgument(arg, "-L"_s, "--label-regex") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->AddPersistentMultiOption("LabelRegularExpression",
                                                     args[i]);
    this->GetMemCheckHandler()->AddPersistentMultiOption(
      "LabelRegularExpression", args[i]);
  } else if (this->CheckArgument(arg, "-LE"_s, "--label-exclude") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->AddPersistentMultiOption(
      "ExcludeLabelRegularExpression", args[i]);
    this->GetMemCheckHandler()->AddPersistentMultiOption(
      "ExcludeLabelRegularExpression", args[i]);
  }

  else if (this->CheckArgument(arg, "-E"_s, "--exclude-regex") &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("ExcludeRegularExpression",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("ExcludeRegularExpression",
                                                    args[i].c_str());
  }

  else if (this->CheckArgument(arg, "-FA"_s, "--fixture-exclude-any") &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption(
      "ExcludeFixtureRegularExpression", args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption(
      "ExcludeFixtureRegularExpression", args[i].c_str());
  } else if (this->CheckArgument(arg, "-FS"_s, "--fixture-exclude-setup") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption(
      "ExcludeFixtureSetupRegularExpression", args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption(
      "ExcludeFixtureSetupRegularExpression", args[i].c_str());
  } else if (this->CheckArgument(arg, "-FC"_s, "--fixture-exclude-cleanup") &&
             i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption(
      "ExcludeFixtureCleanupRegularExpression", args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption(
      "ExcludeFixtureCleanupRegularExpression", args[i].c_str());
  }

  else if (this->CheckArgument(arg, "--resource-spec-file"_s) &&
           i < args.size() - 1) {
    i++;
    this->GetTestHandler()->SetPersistentOption("ResourceSpecFile",
                                                args[i].c_str());
    this->GetMemCheckHandler()->SetPersistentOption("ResourceSpecFile",
                                                    args[i].c_str());
  }

  else if (this->CheckArgument(arg, "--rerun-failed"_s)) {
    this->GetTestHandler()->SetPersistentOption("RerunFailed", "true");
    this->GetMemCheckHandler()->SetPersistentOption("RerunFailed", "true");
  }
  return true;
}